

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

void write_parser_tables(Grammar *g,char *tag,File *file)

{
  byte *pbVar1;
  Rule **ppRVar2;
  Code *pCVar3;
  Code *pCVar4;
  State *pSVar5;
  ScanStateTransition *pSVar6;
  Action *pAVar7;
  Elem *pEVar8;
  Goto *pGVar9;
  D_Pass *pDVar10;
  uint8 **ppuVar11;
  OffsetEntry **__ptr;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  Production *pPVar15;
  Term *pTVar16;
  void *pvVar17;
  void *pvVar18;
  char *pcVar19;
  Action *pAVar20;
  ScanState **ppSVar21;
  uint *puVar22;
  size_t sVar23;
  Goto **ppGVar24;
  State *pSVar25;
  Hint *pHVar26;
  FILE *pFVar27;
  uint8 *puVar28;
  char cVar29;
  uint uVar30;
  Production *pPVar31;
  Rule *pRVar32;
  Rule *pRVar33;
  undefined4 uVar34;
  OffsetEntry *pOVar35;
  ScanState *pSVar36;
  undefined8 uVar37;
  int iVar38;
  ulong uVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  void **ppvVar43;
  long lVar44;
  short *psVar45;
  code *pcVar46;
  char **ppcVar47;
  int *piVar48;
  uint uVar49;
  long lVar50;
  FILE *pFVar51;
  ulong uVar52;
  char *pcVar53;
  int iVar54;
  void *t;
  uint uVar55;
  uint uVar56;
  char *pcVar57;
  ulong uVar58;
  uint *puVar59;
  bool bVar60;
  Rule *local_5a0;
  char *local_578;
  VecState er_hash;
  char final_code [256];
  char speculative_code [256];
  char pass_code [256];
  char fname [256];
  char local_138 [8];
  undefined1 *local_130;
  undefined1 local_128 [248];
  
  er_hash.n = 0;
  er_hash.v = (State **)0x0;
  g->scanner_block_size = (int)(0x100 / (long)g->scanner_blocks);
  pFVar51 = file->fp;
  pPVar15 = lookup_production(g,"_",1);
  if (pPVar15 == (Production *)0x0) {
    local_5a0 = (Rule *)0x0;
  }
  else {
    local_5a0 = *(pPVar15->rules).v;
    myfprintf(pFVar51,"int d_speculative_reduction_code_%d_%d_%s%s;\n",(ulong)local_5a0->prod->index
              ,(ulong)local_5a0->index,tag,
              "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)");
    g->write_line = g->write_line + 1;
    myfprintf(pFVar51,"int d_final_reduction_code_%d_%d_%s%s;\n",(ulong)local_5a0->prod->index,
              (ulong)local_5a0->index,tag);
    g->write_line = g->write_line + 1;
    myfprintf(pFVar51,"extern D_ReductionCode d_pass_code_%d_%d_%s[];\n",
              (ulong)local_5a0->prod->index,(ulong)local_5a0->index,tag);
    g->write_line = g->write_line + 1;
    if (0 < (int)(local_5a0->pass_code).n) {
      uVar42 = 0;
      do {
        myfprintf(pFVar51,"int d_pass_code_%d_%d_%d_%s%s;\n",uVar42,(ulong)local_5a0->prod->index,
                  (ulong)local_5a0->index,tag,
                  "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)");
        g->write_line = g->write_line + 1;
        uVar40 = (int)uVar42 + 1;
        uVar42 = (ulong)uVar40;
      } while ((int)uVar40 < (int)(local_5a0->pass_code).n);
    }
  }
  uVar14 = (g->productions).n;
  if (0 < (int)uVar14) {
    lVar44 = 0;
    do {
      pPVar15 = (g->productions).v[lVar44];
      uVar30 = (pPVar15->rules).n;
      uVar40 = uVar30 - 1;
      if (-1 < (int)uVar40) {
        if (uVar40 != 0) {
          ppRVar2 = (pPVar15->rules).v;
          uVar42 = (ulong)uVar40;
          do {
            pRVar33 = ppRVar2[uVar42];
            uVar52 = 0;
            do {
              pRVar32 = ppRVar2[uVar52];
              if ((((((pRVar33->elems).n == (pRVar32->elems).n) &&
                    ((pRVar33->speculative_code).code == (pRVar32->speculative_code).code)) &&
                   ((pRVar33->final_code).code == (pRVar32->final_code).code)) &&
                  ((pRVar33->op_priority == pRVar32->op_priority &&
                   (pRVar33->op_assoc == pRVar32->op_assoc)))) &&
                 ((pRVar33->rule_priority == pRVar32->rule_priority &&
                  ((pRVar33->rule_assoc == pRVar32->rule_assoc &&
                   (pRVar33->action_index == pRVar32->action_index)))))) {
                uVar40 = (pRVar33->pass_code).n;
                if (uVar40 == (pRVar32->pass_code).n) {
                  if (0 < (int)uVar40) {
                    uVar39 = 0;
                    do {
                      pCVar3 = (pRVar33->pass_code).v[uVar39];
                      pCVar4 = (pRVar32->pass_code).v[uVar39];
                      if (pCVar3 == (Code *)0x0) {
                        if (pCVar4 != (Code *)0x0) goto LAB_00131e72;
                      }
                      else if ((pCVar4 == (Code *)0x0) || (pCVar3->code != pCVar4->code))
                      goto LAB_00131e72;
                      uVar39 = uVar39 + 1;
                      if (uVar40 == uVar39) break;
                    } while( true );
                  }
                  pRVar33->same_reduction = pRVar32;
                  break;
                }
              }
LAB_00131e72:
              uVar52 = uVar52 + 1;
            } while (uVar52 != uVar42);
            uVar42 = uVar42 - 1;
          } while (uVar42 != 0);
        }
        if (0 < (int)uVar30) {
          lVar50 = 0;
          do {
            pRVar33 = (pPVar15->rules).v[lVar50];
            if (pRVar33->same_reduction == (Rule *)0x0) {
              if ((pRVar33->speculative_code).code == (char *)0x0) {
                if ((local_5a0 == (Rule *)0x0) ||
                   ((local_5a0->speculative_code).code == (char *)0x0)) {
                  speculative_code._4_4_ = speculative_code._4_4_ & 0xffffff00;
                  builtin_strncpy(speculative_code,"NULL",4);
                  goto LAB_00131f63;
                }
                snprintf(speculative_code,0xff,"d_speculative_reduction_code_%d_%d_%s",
                         (ulong)local_5a0->prod->index,(ulong)local_5a0->index);
                if ((pRVar33->final_code).code == (char *)0x0) goto LAB_00131f7f;
LAB_00131f6e:
                uVar40 = pRVar33->prod->index;
                uVar49 = pRVar33->index;
LAB_00131f93:
                snprintf(final_code,0xff,"d_final_reduction_code_%d_%d_%s",(ulong)uVar40,
                         (ulong)uVar49);
              }
              else {
                snprintf(speculative_code,0xff,"d_speculative_reduction_code_%d_%d_%s",
                         (ulong)pRVar33->prod->index,(ulong)pRVar33->index);
LAB_00131f63:
                if ((pRVar33->final_code).code != (char *)0x0) goto LAB_00131f6e;
                if (local_5a0 != (Rule *)0x0) {
LAB_00131f7f:
                  if ((local_5a0->final_code).code == (char *)0x0) goto LAB_00131fb3;
                  uVar40 = local_5a0->prod->index;
                  uVar49 = local_5a0->index;
                  goto LAB_00131f93;
                }
LAB_00131fb3:
                final_code._4_4_ = final_code._4_4_ & 0xffffff00;
                builtin_strncpy(final_code,"NULL",4);
              }
              if ((pRVar33->speculative_code).code != (char *)0x0) {
                snprintf(fname,0xff,"int d_speculative_reduction_code_%d_%d_%s%s ",
                         (ulong)pRVar33->prod->index,(ulong)pRVar33->index,tag,
                         "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)"
                        );
                write_code(file,g,pRVar33,speculative_code,(pRVar33->speculative_code).code,fname,
                           (pRVar33->speculative_code).line,g->pathname);
              }
              if ((pRVar33->final_code).code != (char *)0x0) {
                snprintf(fname,0xff,"int d_final_reduction_code_%d_%d_%s%s ",
                         (ulong)pRVar33->prod->index,(ulong)pRVar33->index,tag,
                         "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)"
                        );
                write_code(file,g,pRVar33,final_code,(pRVar33->final_code).code,fname,
                           (pRVar33->final_code).line,g->pathname);
              }
              uVar14 = (pRVar33->pass_code).n;
              if (0 < (int)uVar14) {
                uVar42 = 0;
                do {
                  if ((pRVar33->pass_code).v[uVar42] != (Code *)0x0) {
                    snprintf(fname,0xff,"int d_pass_code_%d_%d_%d_%s%s ",uVar42 & 0xffffffff,
                             (ulong)pRVar33->prod->index,(ulong)pRVar33->index,tag,
                             "(void *_ps, void **_children, int _n_children, int _offset, D_Parser *_parser)"
                            );
                    snprintf(local_138,0xff,"int d_pass_code_%d_%d_%d_%s",uVar42 & 0xffffffff,
                             (ulong)pRVar33->prod->index,(ulong)pRVar33->index,tag);
                    pCVar3 = (pRVar33->pass_code).v[uVar42];
                    write_code(file,g,pRVar33,local_138,pCVar3->code,fname,pCVar3->line,g->pathname)
                    ;
                    uVar14 = (pRVar33->pass_code).n;
                  }
                  uVar42 = uVar42 + 1;
                } while ((long)uVar42 < (long)(int)uVar14);
              }
              if (uVar14 == 0) {
                if ((local_5a0 == (Rule *)0x0) || (uVar14 = (local_5a0->pass_code).n, uVar14 == 0))
                {
                  builtin_strncpy(pass_code,"NULL",5);
                  uVar14 = 0;
                }
                else {
                  if ((int)uVar14 < 1) {
                    uVar14 = 0;
                  }
                  snprintf(pass_code,0xff,"d_pass_code_%d_%d_%s",(ulong)local_5a0->prod->index,
                           (ulong)local_5a0->index);
                }
              }
              else {
                if ((local_5a0 != (Rule *)0x0) &&
                   (uVar30 = (local_5a0->pass_code).n, (int)uVar14 < (int)uVar30)) {
                  uVar14 = uVar30;
                }
                snprintf(pass_code,0xff,"d_pass_code_%d_%d_%s",(ulong)pRVar33->prod->index,
                         (ulong)pRVar33->index);
                myfprintf(pFVar51,"D_ReductionCode %s[] = {",pass_code);
                if (0 < (int)uVar14) {
                  uVar42 = 0;
                  do {
                    if (((long)uVar42 < (long)(int)(pRVar33->pass_code).n) &&
                       ((pRVar33->pass_code).v[uVar42] != (Code *)0x0)) {
                      uVar40 = pRVar33->prod->index;
                      uVar49 = pRVar33->index;
LAB_00132246:
                      pcVar53 = "";
                      if (uVar42 < uVar14 - 1) {
                        pcVar53 = ", ";
                      }
                      myfprintf(pFVar51,"d_pass_code_%d_%d_%d_%s%s",uVar42 & 0xffffffff,
                                (ulong)uVar40,(ulong)uVar49,tag,pcVar53);
                    }
                    else {
                      if ((local_5a0 != (Rule *)0x0) &&
                         (((long)uVar42 < (long)(int)(local_5a0->pass_code).n &&
                          ((local_5a0->pass_code).v[uVar42] != (Code *)0x0)))) {
                        uVar40 = local_5a0->prod->index;
                        uVar49 = local_5a0->index;
                        goto LAB_00132246;
                      }
                      pcVar53 = "";
                      if (uVar42 < uVar14 - 1) {
                        pcVar53 = ", ";
                      }
                      myfprintf(pFVar51,"NULL%s",pcVar53);
                    }
                    uVar42 = uVar42 + 1;
                  } while (uVar14 != uVar42);
                }
                myfprintf(pFVar51,"};\n\n");
                g->write_line = g->write_line + 2;
              }
              pcVar53 = make_name("d_reduction_%d_%s",(ulong)pRVar33->index,tag);
              start_struct_fn(file,0x38,"D_Reduction",pcVar53,"");
              if (file->binary == 0) {
                if (file->first_member == 0) {
                  myfprintf(file->fp,", ");
                }
                file->first_member = 0;
                myfprintf(file->fp,"%d",(ulong)(pRVar33->elems).n);
                if (file->binary != 0) {
                  pcVar53 = (file->tables).cur;
                  goto LAB_001323cb;
                }
                if (file->first_member == 0) {
                  myfprintf(file->fp,", ");
                }
                file->first_member = 0;
                myfprintf(file->fp,"%d",(ulong)pRVar33->prod->index);
                if (file->binary != 0) {
                  pPVar31 = pRVar33->prod;
                  goto LAB_001323d7;
                }
                myfprintf(pFVar51,", %s",speculative_code);
                myfprintf(pFVar51,", %s",final_code);
              }
              else {
                pcVar53 = (file->tables).cur;
                *(short *)pcVar53 = (short)(pRVar33->elems).n;
LAB_001323cb:
                pPVar31 = pRVar33->prod;
                *(short *)(pcVar53 + 2) = (short)pPVar31->index;
LAB_001323d7:
                if ((pPVar31->field_0x3c & 0x1c) == 0) {
                  pcVar53 = (file->tables).cur;
                  if (pRVar33->action_index < 0) goto LAB_001323e1;
                  if (pcVar53 == (char *)0x0) {
                    ppvVar43 = (void **)0x0;
                  }
                  else {
                    ppvVar43 = (void **)(pcVar53 + 8);
                  }
                  add_struct_ptr_member_fn(file,ppvVar43,&spec_code_entry,"%s");
                  pcVar53 = (file->tables).cur;
                  if (pcVar53 == (char *)0x0) {
                    ppvVar43 = (void **)0x0;
                  }
                  else {
                    ppvVar43 = (void **)(pcVar53 + 0x10);
                  }
                  pOVar35 = &final_code_entry;
                }
                else {
                  pcVar53 = (file->tables).cur;
LAB_001323e1:
                  if (pcVar53 == (char *)0x0) {
                    ppvVar43 = (void **)0x0;
                  }
                  else {
                    ppvVar43 = (void **)(pcVar53 + 8);
                  }
                  add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
                  pcVar53 = (file->tables).cur;
                  if (pcVar53 == (char *)0x0) {
                    ppvVar43 = (void **)0x0;
                  }
                  else {
                    ppvVar43 = (void **)(pcVar53 + 0x10);
                  }
                  pOVar35 = &null_entry;
                }
                add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
              }
              if (file->binary == 0) {
                if (file->first_member == 0) {
                  myfprintf(file->fp,", ");
                }
                file->first_member = 0;
                myfprintf(file->fp,"%d",(ulong)pRVar33->op_assoc);
                if (file->binary != 0) {
                  pcVar53 = (file->tables).cur;
                  goto LAB_00132527;
                }
                if (file->first_member == 0) {
                  myfprintf(file->fp,", ");
                }
                file->first_member = 0;
                myfprintf(file->fp,"%d",(ulong)pRVar33->rule_assoc);
                if (file->binary != 0) {
                  pcVar53 = (file->tables).cur;
                  goto LAB_00132530;
                }
                if (file->first_member == 0) {
                  myfprintf(file->fp,", ");
                }
                file->first_member = 0;
                myfprintf(file->fp,"%d",(ulong)(uint)pRVar33->op_priority);
                if (file->binary != 0) {
                  pcVar53 = (file->tables).cur;
                  goto LAB_00132537;
                }
                if (file->first_member == 0) {
                  myfprintf(file->fp,", ");
                }
                file->first_member = 0;
                myfprintf(file->fp,"%d",(ulong)(uint)pRVar33->rule_priority);
                if (file->binary != 0) goto LAB_0013253e;
                if (file->first_member == 0) {
                  myfprintf(file->fp,", ");
                }
                file->first_member = 0;
                uVar42 = 0xffffffff;
                if ((pRVar33->prod->field_0x3c & 0x1c) == 0) {
                  uVar42 = (ulong)(uint)pRVar33->action_index;
                }
                myfprintf(file->fp,"%d",uVar42);
                if (file->binary != 0) {
                  pcVar53 = (file->tables).cur;
                  goto LAB_0013255b;
                }
                if (file->first_member == 0) {
                  myfprintf(file->fp,", ");
                }
                file->first_member = 0;
                myfprintf(file->fp,"%d",(ulong)uVar14);
                if (file->binary != 0) {
                  pcVar53 = (file->tables).cur;
                  if (pcVar53 != (char *)0x0) goto LAB_00132564;
                  ppvVar43 = (void **)0x0;
                  goto LAB_0013256b;
                }
                myfprintf(pFVar51,", %s",pass_code);
              }
              else {
                pcVar53 = (file->tables).cur;
                *(short *)(pcVar53 + 0x18) = (short)pRVar33->op_assoc;
LAB_00132527:
                *(short *)(pcVar53 + 0x1a) = (short)pRVar33->rule_assoc;
LAB_00132530:
                *(int *)(pcVar53 + 0x1c) = pRVar33->op_priority;
LAB_00132537:
                *(int *)(pcVar53 + 0x20) = pRVar33->rule_priority;
LAB_0013253e:
                iVar41 = -1;
                if ((pRVar33->prod->field_0x3c & 0x1c) == 0) {
                  iVar41 = pRVar33->action_index;
                }
                pcVar53 = (file->tables).cur;
                *(int *)(pcVar53 + 0x24) = iVar41;
LAB_0013255b:
                *(uint *)(pcVar53 + 0x28) = uVar14;
LAB_00132564:
                ppvVar43 = (void **)(pcVar53 + 0x30);
LAB_0013256b:
                add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
              }
              if (file->binary == 0) {
                myfprintf(file->fp,"};%s","\n");
              }
              else {
                ppcVar47 = &(file->tables).cur;
                *ppcVar47 = *ppcVar47 + 0x38;
              }
              g->write_line = g->write_line + 1;
              uVar30 = (pPVar15->rules).n;
            }
            lVar50 = lVar50 + 1;
          } while (lVar50 < (int)uVar30);
          uVar14 = (g->productions).n;
        }
      }
      lVar44 = lVar44 + 1;
    } while (lVar44 < (int)uVar14);
  }
  if ((g->terminals).n != 0) {
    uVar42 = 0;
    do {
      pTVar16 = (g->terminals).v[uVar42];
      pPVar15 = pTVar16->regex_production;
      if ((pPVar15 == (Production *)0x0) ||
         (pRVar33 = *(pPVar15->rules).v, (pRVar33->speculative_code).code == (char *)0x0)) {
        final_code._4_4_ = final_code._4_4_ & 0xffffff00;
        builtin_strncpy(final_code,"NULL",4);
      }
      else {
        if (file->binary != 0) {
          __assert_fail("!fp->binary",
                        "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                        ,0x24d,"void write_scanner_data(File *, Grammar *, char *)");
        }
        snprintf(final_code,0xff,"d_speculative_reduction_code_%d_%d_%s",(ulong)pPVar15->index,
                 (ulong)pRVar33->index,tag);
        pPVar15 = pTVar16->regex_production;
      }
      if (pPVar15 == (Production *)0x0) {
        iVar41 = -1;
      }
      else {
        iVar41 = (*(pPVar15->rules).v)->action_index;
      }
      pcVar53 = make_name("d_shift_%d_%s",uVar42 & 0xffffffff,tag);
      start_struct_fn(file,0x18,"D_Shift",pcVar53,"");
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)((g->productions).n + (g->terminals).v[uVar42]->index));
        if (file->binary != 0) {
          pTVar16 = (g->terminals).v[uVar42];
          psVar45 = (short *)(file->tables).cur;
          goto LAB_00132938;
        }
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)((byte)(g->terminals).v[uVar42]->field_0x2c & 7));
        if (file->binary != 0) {
          pTVar16 = (g->terminals).v[uVar42];
          psVar45 = (short *)(file->tables).cur;
          goto LAB_00132941;
        }
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)(g->terminals).v[uVar42]->op_assoc);
        if (file->binary != 0) {
          pTVar16 = (g->terminals).v[uVar42];
          psVar45 = (short *)(file->tables).cur;
          goto LAB_00132947;
        }
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar42]->op_priority);
        if (file->binary != 0) {
          pTVar16 = (g->terminals).v[uVar42];
          psVar45 = (short *)(file->tables).cur;
          goto LAB_0013294d;
        }
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar42]->term_priority);
        if (file->binary != 0) {
          psVar45 = (short *)(file->tables).cur;
          goto LAB_00132953;
        }
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",0);
        myfprintf(file->fp,", %s",final_code);
      }
      else {
        pTVar16 = (g->terminals).v[uVar42];
        psVar45 = (short *)(file->tables).cur;
        *psVar45 = (short)(g->productions).n + (short)pTVar16->index;
LAB_00132938:
        *(byte *)(psVar45 + 1) = pTVar16->field_0x2c & 7;
LAB_00132941:
        *(char *)((long)psVar45 + 3) = (char)pTVar16->op_assoc;
LAB_00132947:
        *(int *)(psVar45 + 2) = pTVar16->op_priority;
LAB_0013294d:
        *(int *)(psVar45 + 4) = pTVar16->term_priority;
LAB_00132953:
        *(int *)(psVar45 + 6) = iVar41;
        add_struct_ptr_member_fn(file,(void **)(psVar45 + 8),&spec_code_entry,"%s");
      }
      if (file->binary == 0) {
        myfprintf(file->fp,"};%s","\n");
      }
      else {
        ppcVar47 = &(file->tables).cur;
        *ppcVar47 = *ppcVar47 + 0x18;
      }
      g->write_line = g->write_line + 1;
      if (((g->terminals).v[uVar42]->field_0x2c & 0x10) != 0) {
        pcVar53 = make_name("d_tshift_%d_%s",uVar42 & 0xffffffff,tag);
        start_struct_fn(file,0x18,"D_Shift",pcVar53,"");
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)((g->productions).n + (g->terminals).v[uVar42]->index));
          if (file->binary != 0) {
            psVar45 = (short *)(file->tables).cur;
            goto LAB_00132a68;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",3);
          if (file->binary != 0) {
            psVar45 = (short *)(file->tables).cur;
            goto LAB_00132a6c;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(g->terminals).v[uVar42]->op_assoc);
          if (file->binary != 0) {
            pTVar16 = (g->terminals).v[uVar42];
            psVar45 = (short *)(file->tables).cur;
            goto LAB_00132a7a;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar42]->op_priority);
          if (file->binary != 0) {
            pTVar16 = (g->terminals).v[uVar42];
            psVar45 = (short *)(file->tables).cur;
            goto LAB_00132a80;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)(uint)(g->terminals).v[uVar42]->term_priority);
          if (file->binary != 0) {
            psVar45 = (short *)(file->tables).cur;
            goto LAB_00132a86;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",0);
          myfprintf(file->fp,", %s",final_code);
        }
        else {
          psVar45 = (short *)(file->tables).cur;
          *psVar45 = (short)(g->productions).n + (short)(g->terminals).v[uVar42]->index;
LAB_00132a68:
          *(undefined1 *)(psVar45 + 1) = 3;
LAB_00132a6c:
          pTVar16 = (g->terminals).v[uVar42];
          *(char *)((long)psVar45 + 3) = (char)pTVar16->op_assoc;
LAB_00132a7a:
          *(int *)(psVar45 + 2) = pTVar16->op_priority;
LAB_00132a80:
          *(int *)(psVar45 + 4) = pTVar16->term_priority;
LAB_00132a86:
          *(int *)(psVar45 + 6) = iVar41;
          add_struct_ptr_member_fn(file,(void **)(psVar45 + 8),&spec_code_entry,"%s");
        }
        if (file->binary == 0) {
          myfprintf(file->fp,"};%s","\n");
        }
        else {
          ppcVar47 = &(file->tables).cur;
          *ppcVar47 = *ppcVar47 + 0x18;
        }
        g->write_line = g->write_line + 1;
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < (g->terminals).n);
  }
  if (file->binary == 0) {
    myfprintf(file->fp,"%s","\n");
  }
  g->write_line = g->write_line + 1;
  uVar42 = (ulong)(g->states).n;
  uVar40 = 0;
  if (uVar42 != 0) {
    uVar52 = 0;
    uVar40 = 0;
    do {
      uVar40 = uVar40 + ((g->states).v[uVar52]->scanner).states.n * g->scanner_blocks;
      uVar52 = uVar52 + 1;
    } while (uVar42 != uVar52);
  }
  pvVar17 = malloc((ulong)(uVar40 + (uVar40 == 0)) << 5);
  lVar44 = 8;
  do {
    pcVar53 = speculative_code + lVar44 + 0xf8;
    pcVar53[0] = '\0';
    pcVar53[1] = '\0';
    pcVar53[2] = '\0';
    pcVar53[3] = '\0';
    pcVar53 = pass_code + lVar44;
    pcVar53[0] = '\0';
    pcVar53[1] = '\0';
    pcVar53[2] = '\0';
    pcVar53[3] = '\0';
    pcVar53[4] = '\0';
    pcVar53[5] = '\0';
    pcVar53[6] = '\0';
    pcVar53[7] = '\0';
    pcVar53 = pass_code + lVar44 + 0xf8;
    pcVar53[0] = '\0';
    pcVar53[1] = '\0';
    pcVar53[2] = '\0';
    pcVar53[3] = '\0';
    pcVar53 = fname + lVar44;
    pcVar53[0] = '\0';
    pcVar53[1] = '\0';
    pcVar53[2] = '\0';
    pcVar53[3] = '\0';
    pcVar53[4] = '\0';
    pcVar53[5] = '\0';
    pcVar53[6] = '\0';
    pcVar53[7] = '\0';
    lVar44 = lVar44 + 0x28;
  } while (lVar44 != 0xa8);
  scanner_block_fns.data[0] = (void *)(long)g->scanner_block_size;
  local_138[0] = '\0';
  local_138[1] = '\0';
  local_138[2] = '\0';
  local_138[3] = '\0';
  local_130 = (undefined1 *)0x0;
  scanner_block_fns.data[1] = g;
  trans_scanner_block_fns.data[0] = scanner_block_fns.data[0];
  trans_scanner_block_fns.data[1] = g;
  if (uVar42 != 0) {
    uVar42 = 0;
    uVar49 = 0;
    do {
      pSVar5 = (g->states).v[uVar42];
      if (pSVar5->same_shifts == (State *)0x0) {
        if ((pSVar5->scanner).transitions.n != 0) {
          uVar52 = 0;
          do {
            pSVar6 = (pSVar5->scanner).transitions.v[uVar52];
            pcVar53 = make_name("d_accepts_diff_%d_%d_%s",uVar42 & 0xffffffff,uVar52 & 0xffffffff,
                                tag);
            start_array_fn(file,8,"","D_Shift *",pcVar53,"",0,"");
            if ((pSVar6->accepts_diff).n != 0) {
              uVar39 = 0;
              do {
                pAVar7 = (pSVar6->accepts_diff).v[uVar39];
                pcVar53 = "d_shift_%d_%s";
                if (pAVar7->kind == ACTION_SHIFT_TRAILING) {
                  pcVar53 = "d_tshift_%d_%s";
                }
                pOVar35 = get_offset(file,pcVar53,(ulong)pAVar7->term->index);
                add_array_ptr_member_fn(file,pOVar35,"&%s%s",0);
                uVar39 = uVar39 + 1;
              } while (uVar39 < (pSVar6->accepts_diff).n);
            }
            if (file->binary == 0) {
              myfprintf(file->fp,"%d%s",0,"");
            }
            else {
              file->n_elems = file->n_elems + 1;
              make_room_in_buf(&file->tables,(long)file->elem_size);
              pcVar53 = (file->tables).cur;
              pcVar53[0] = '\0';
              pcVar53[1] = '\0';
              pcVar53[2] = '\0';
              pcVar53[3] = '\0';
              pcVar53[4] = '\0';
              pcVar53[5] = '\0';
              pcVar53[6] = '\0';
              pcVar53[7] = '\0';
              ppcVar47 = &(file->tables).cur;
              *ppcVar47 = *ppcVar47 + file->elem_size;
            }
            end_array(file,"\n");
            g->write_line = g->write_line + 2;
            uVar52 = uVar52 + 1;
            uVar55 = (pSVar5->scanner).transitions.n;
          } while (uVar52 < uVar55);
          if (uVar55 != 0) {
            pcVar53 = make_name("d_accepts_diff_%d_%s",uVar42 & 0xffffffff,tag);
            start_array_fn(file,8,"","D_Shift **",pcVar53,"",0,"\n");
            if ((pSVar5->scanner).transitions.n != 0) {
              uVar52 = 0;
              do {
                iVar41 = (int)uVar52;
                pOVar35 = get_offset(file,"d_accepts_diff_%d_%d_%s",uVar42 & 0xffffffff,uVar52,tag);
                add_array_ptr_member_fn
                          (file,pOVar35,"%s%s",(uint)(iVar41 == (pSVar5->scanner).transitions.n - 1)
                          );
                if (file->binary == 0) {
                  myfprintf(file->fp,"%s","\n");
                }
                uVar55 = (pSVar5->scanner).transitions.n;
                if (iVar41 != uVar55 - 1) {
                  g->write_line = g->write_line + 1;
                }
                uVar52 = (ulong)(iVar41 + 1U);
              } while (iVar41 + 1U < uVar55);
            }
            end_array(file,"\n\n");
            g->write_line = g->write_line + 3;
          }
        }
        uVar55 = (pSVar5->scanner).states.n;
        if (uVar55 < 0xff) {
          uVar56 = (pSVar5->scanner).transitions.n;
          if (0xfe < uVar56) {
LAB_00133272:
            local_578 = pass_code + 0x28;
            if (0x7e7f < uVar56) goto LAB_00133287;
            goto LAB_00133294;
          }
          local_578 = pass_code;
LAB_001332ae:
          lVar44 = 0;
LAB_001332d7:
          if (uVar55 == 0) goto LAB_00133950;
          pcVar53 = fname + lVar44 * 0x28;
        }
        else {
          if (uVar55 < 0x7e80) {
            uVar56 = (pSVar5->scanner).transitions.n;
            goto LAB_00133272;
          }
LAB_00133287:
          local_578 = pass_code + 0x78;
LAB_00133294:
          if (uVar55 < 0xff) {
            uVar56 = (pSVar5->scanner).transitions.n;
            if (0xfe < uVar56) goto LAB_001332c4;
            goto LAB_001332ae;
          }
          if (uVar55 < 0x7e80) {
            uVar56 = (pSVar5->scanner).transitions.n;
LAB_001332c4:
            lVar44 = (ulong)(0x7e7f < uVar56) * 2 + 1;
            goto LAB_001332d7;
          }
          pcVar53 = fname + 0x78;
        }
        uVar52 = 0;
        do {
          if (pSVar5->same_shifts == (State *)0x0) {
            if (0 < g->scanner_blocks) {
              uVar39 = 0;
              do {
                lVar50 = (ulong)uVar49 * 0x20;
                *(uint *)((long)pvVar17 + lVar50) = pSVar5->index;
                *(int *)((long)pvVar17 + lVar50 + 4) = (int)uVar52;
                iVar41 = (int)uVar39;
                *(int *)((long)pvVar17 + lVar50 + 8) = iVar41;
                ppSVar21 = (pSVar5->scanner).states.v;
                lVar44 = (long)iVar41 * (long)g->scanner_block_size;
                *(ScanState ***)((long)pvVar17 + lVar50 + 0x10) = ppSVar21[uVar52]->chars + lVar44;
                *(ScanStateTransition ***)((long)pvVar17 + lVar50 + 0x18) =
                     ppSVar21[uVar52]->transition + lVar44;
                uVar49 = uVar49 + 1;
                if (uVar40 < uVar49) {
                  __assert_fail("ivsblock <= nvsblocks",
                                "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                                ,0x2b4,"void write_scanner_data(File *, Grammar *, char *)");
                }
                t = (void *)(lVar50 + (long)pvVar17);
                pvVar18 = set_add_fn(local_578,t,&scanner_block_fns);
                if (t == pvVar18) {
                  uVar55 = (pSVar5->scanner).states.n;
                  if (uVar55 < 0xff) {
                    uVar55 = (pSVar5->scanner).transitions.n;
                    iVar54 = 1;
                    pcVar57 = "unsigned char";
                    if (0xfe < uVar55) {
LAB_001333e9:
                      iVar54 = 2;
                      pcVar57 = "unsigned short";
                      if (0x7e7f < uVar55) goto LAB_001333fd;
                    }
                  }
                  else {
                    if (uVar55 < 0x7e80) {
                      uVar55 = (pSVar5->scanner).transitions.n;
                      goto LAB_001333e9;
                    }
LAB_001333fd:
                    iVar54 = 4;
                    pcVar57 = "unsigned int";
                  }
                  pcVar19 = make_name("d_scanner_%d_%d_%d_%s",uVar42,uVar52 & 0xffffffff,uVar39,tag)
                  ;
                  start_array_fn(file,iVar54,"",pcVar57,pcVar19,"SCANNER_BLOCK_SIZE",0x40,"\n");
                  iVar38 = g->scanner_block_size;
                  if (0 < iVar38) {
                    uVar55 = 0;
                    do {
                      pcVar46 = unsigned_char_copy;
                      if (iVar54 != 1) {
                        if (iVar54 == 4) {
                          pcVar46 = unsigned_int_copy;
                        }
                        else if (iVar54 == 2) {
                          pcVar46 = unsigned_short_copy;
                        }
                        else {
                          d_fail("bad case");
                          pcVar46 = (CopyFuncType)0x0;
                        }
                      }
                      pSVar36 = (pSVar5->scanner).states.v[uVar52]->chars[iVar38 * iVar41 + uVar55];
                      if (pSVar36 == (ScanState *)0x0) {
                        pcVar57 = (char *)0x0;
                      }
                      else {
                        pcVar57 = (char *)(ulong)(pSVar36->index + 1);
                      }
                      add_array_member_fn(file,pcVar46,pcVar57,
                                          (uint)(uVar55 == g->scanner_block_size),(int)pcVar19);
                      if ((~uVar55 & 0xf) == 0) {
                        if (file->binary == 0) {
                          myfprintf(file->fp,"%s","\n");
                        }
                        g->write_line = g->write_line + 1;
                      }
                      uVar55 = uVar55 + 1;
                      iVar38 = g->scanner_block_size;
                    } while ((int)uVar55 < iVar38);
                  }
                  end_array(file,"\n\n");
                  g->write_line = g->write_line + 3;
                }
                if (((pSVar5->field_0x178 & 0x78) != 8) &&
                   (pvVar18 = set_add_fn(pcVar53,t,&trans_scanner_block_fns), t == pvVar18)) {
                  uVar55 = (pSVar5->scanner).states.n;
                  if (uVar55 < 0xff) {
                    uVar55 = (pSVar5->scanner).transitions.n;
                    iVar54 = 1;
                    pcVar57 = "unsigned char";
                    if (0xfe < uVar55) {
LAB_001335d7:
                      iVar54 = 2;
                      pcVar57 = "unsigned short";
                      if (0x7e7f < uVar55) goto LAB_001335eb;
                    }
                  }
                  else {
                    if (uVar55 < 0x7e80) {
                      uVar55 = (pSVar5->scanner).transitions.n;
                      goto LAB_001335d7;
                    }
LAB_001335eb:
                    iVar54 = 4;
                    pcVar57 = "unsigned int";
                  }
                  pcVar19 = make_name("d_accepts_diff_%d_%d_%d_%s",uVar42,uVar52 & 0xffffffff,uVar39
                                      ,tag);
                  start_array_fn(file,iVar54,"",pcVar57,pcVar19,"SCANNER_BLOCK_SIZE",0x40,"\n");
                  uVar55 = g->scanner_block_size;
                  if (0 < (int)uVar55) {
                    uVar56 = 0;
                    do {
                      pcVar46 = unsigned_char_copy;
                      uVar13 = uVar55;
                      if (iVar54 != 1) {
                        if (iVar54 == 4) {
                          pcVar46 = unsigned_int_copy;
                        }
                        else if (iVar54 == 2) {
                          pcVar46 = unsigned_short_copy;
                        }
                        else {
                          d_fail("bad case");
                          pcVar46 = (CopyFuncType)0x0;
                          uVar13 = g->scanner_block_size;
                        }
                      }
                      add_array_member_fn(file,pcVar46,
                                          (char *)(ulong)(pSVar5->scanner).states.v[uVar52]->
                                                         transition[uVar55 * iVar41 + uVar56]->index
                                          ,(uint)(uVar56 == uVar13),(int)pcVar19);
                      if ((~uVar56 & 0xf) == 0) {
                        if (file->binary == 0) {
                          myfprintf(file->fp,"%s","\n");
                        }
                        g->write_line = g->write_line + 1;
                      }
                      uVar56 = uVar56 + 1;
                      uVar55 = g->scanner_block_size;
                    } while ((int)uVar56 < (int)uVar55);
                  }
                  end_array(file,"\n\n");
                  g->write_line = g->write_line + 3;
                }
                uVar39 = (ulong)(iVar41 + 1U);
              } while ((int)(iVar41 + 1U) < g->scanner_blocks);
            }
            if (((pSVar5->scanner).states.v[uVar52]->accepts).n != 0) {
              snprintf(speculative_code,0xff,"d_shift_%d_%d_%s",uVar42,uVar52 & 0xffffffff,tag);
              ppSVar21 = (pSVar5->scanner).states.v;
              pSVar36 = ppSVar21[uVar52];
              uVar55 = (pSVar36->accepts).n;
              uVar39 = (ulong)uVar55;
              if (uVar55 != 0) {
                uVar58 = 0;
                do {
                  pAVar7 = (pSVar36->accepts).v[uVar58];
                  if ((int)uVar39 == 1) {
                    if (pAVar7->temp_string == (char *)0x0) {
                      pcVar57 = dup_str(speculative_code,(char *)0x0);
                      pAVar7->temp_string = pcVar57;
                      pAVar20 = (Action *)set_add_fn(local_138,pAVar7,&shift_fns);
                      if (pAVar20 == pAVar7) goto LAB_00133821;
                      ppSVar21 = (pSVar5->scanner).states.v;
                    }
                  }
                  else {
LAB_00133821:
                    if (uVar58 == 0) {
                      pcVar57 = make_name(speculative_code);
                      start_array_fn(file,8,"","D_Shift *",pcVar57,"",0,"");
                    }
                    if (pAVar7->kind == ACTION_SHIFT_TRAILING) {
                      pcVar57 = "d_tshift_%d_%s";
                    }
                    else {
                      pcVar57 = "d_shift_%d_%s";
                    }
                    pOVar35 = get_offset(file,pcVar57,(ulong)pAVar7->term->index);
                    add_array_ptr_member_fn(file,pOVar35,"&%s%s",0);
                    ppSVar21 = (pSVar5->scanner).states.v;
                    uVar39 = (ulong)((ppSVar21[uVar52]->accepts).n - 1);
                    if (uVar58 == uVar39) {
                      add_array_ptr_member_fn(file,&null_entry,"&%s%s",1);
                      end_array(file,"\n\n");
                      ppSVar21 = (pSVar5->scanner).states.v;
                      uVar39 = (ulong)((ppSVar21[uVar52]->accepts).n - 1);
                    }
                    if (uVar58 == uVar39) {
                      g->write_line = g->write_line + 2;
                    }
                  }
                  uVar58 = uVar58 + 1;
                  pSVar36 = ppSVar21[uVar52];
                  uVar39 = (ulong)(pSVar36->accepts).n;
                } while (uVar58 < uVar39);
              }
            }
          }
          uVar52 = uVar52 + 1;
        } while (uVar52 < (pSVar5->scanner).states.n);
      }
LAB_00133950:
      uVar42 = uVar42 + 1;
      uVar55 = (g->states).n;
    } while (uVar42 < uVar55);
    if (uVar55 != 0) {
      uVar42 = 0;
      do {
        pSVar5 = (g->states).v[uVar42];
        uVar40 = (pSVar5->scanner).states.n;
        if ((uVar40 != 0) && (pSVar5->same_shifts == (State *)0x0)) {
          if (uVar40 < 0xff) {
            uVar40 = (pSVar5->scanner).transitions.n;
            pcVar53 = "uint8";
            if (0xfe < uVar40) {
LAB_001339bd:
              pcVar53 = "uint16";
              if (0x7e7f < uVar40) goto LAB_001339cb;
            }
          }
          else {
            if (uVar40 < 0x7e80) {
              uVar40 = (pSVar5->scanner).transitions.n;
              goto LAB_001339bd;
            }
LAB_001339cb:
            pcVar53 = "uint32";
          }
          pcVar57 = make_name("d_scanner_%d_%s",uVar42,tag);
          start_array_fn(file,0x28,"SB_",pcVar53,pcVar57,"",(pSVar5->scanner).states.n,"\n");
          g->write_line = g->write_line + 1;
          uVar40 = (pSVar5->scanner).states.n;
          if (uVar40 < 0xff) {
            uVar49 = (pSVar5->scanner).transitions.n;
            local_5a0 = (Rule *)pass_code;
            if (0xfe < uVar49) {
LAB_00133a61:
              local_5a0 = (Rule *)(pass_code + 0x28);
              if (0x7e7f < uVar49) goto LAB_00133a76;
            }
          }
          else {
            if (uVar40 < 0x7e80) {
              uVar49 = (pSVar5->scanner).transitions.n;
              goto LAB_00133a61;
            }
LAB_00133a76:
            local_5a0 = (Rule *)(pass_code + 0x78);
          }
          if (uVar40 != 0) {
            uVar52 = 0;
            do {
              start_struct_in_array(file);
              pSVar36 = (pSVar5->scanner).states.v[uVar52];
              uVar14 = (pSVar36->accepts).n;
              if (uVar14 == 0) {
                if (file != (File *)0x0) {
                  ppvVar43 = (void **)(file->tables).cur;
                  if (ppvVar43 == (void **)0x0) {
                    ppvVar43 = (void **)0x0;
                  }
                  pOVar35 = &null_entry;
                  goto LAB_00133b78;
                }
              }
              else if (uVar14 == 1) {
                pvVar18 = set_add_fn(local_138,*(pSVar36->accepts).v,&shift_fns);
                if (file != (File *)0x0) {
                  ppvVar43 = (void **)(file->tables).cur;
                  pOVar35 = get_offset(file,"%s",*(undefined8 *)((long)pvVar18 + 0x28));
                  if (ppvVar43 == (void **)0x0) {
                    ppvVar43 = (void **)0x0;
                  }
LAB_00133b78:
                  add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
                }
              }
              else if (file != (File *)0x0) {
                ppvVar43 = (void **)(file->tables).cur;
                pOVar35 = get_offset(file,"d_shift_%d_%d_%s",uVar42,uVar52 & 0xffffffff,tag);
                if (ppvVar43 == (void **)0x0) {
                  ppvVar43 = (void **)0x0;
                }
                goto LAB_00133b78;
              }
              if (file->binary == 0) {
                myfprintf(file->fp,"%s",", {");
                file->first_member = 1;
              }
              if (0 < g->scanner_blocks) {
                lVar44 = 8;
                uVar39 = 0;
                do {
                  speculative_code._0_4_ = pSVar5->index;
                  speculative_code._8_4_ = (undefined4)uVar39;
                  ppSVar21 = (pSVar5->scanner).states.v;
                  lVar50 = (long)(int)speculative_code._8_4_ * (long)g->scanner_block_size;
                  speculative_code._16_8_ = ppSVar21[uVar52]->chars + lVar50;
                  speculative_code._24_8_ = ppSVar21[uVar52]->transition + lVar50;
                  speculative_code._4_4_ = (int)uVar52;
                  puVar22 = (uint *)set_add_fn(local_5a0,speculative_code,&scanner_block_fns);
                  if (puVar22 == (uint *)speculative_code) {
                    __assert_fail("yv != xv",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                                  ,0x321,"void write_scanner_data(File *, Grammar *, char *)");
                  }
                  if (file != (File *)0x0) {
                    pcVar53 = (file->tables).cur;
                    if (pcVar53 == (char *)0x0) {
                      pOVar35 = get_offset(file,"d_scanner_%d_%d_%d_%s",(ulong)*puVar22,
                                           (ulong)puVar22[1],(ulong)puVar22[2],tag);
                      ppvVar43 = (void **)0x0;
                    }
                    else {
                      ppvVar43 = (void **)(pcVar53 + lVar44);
                      pOVar35 = get_offset(file,"d_scanner_%d_%d_%d_%s",(ulong)*puVar22,
                                           (ulong)puVar22[1],(ulong)puVar22[2],tag);
                    }
                    add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
                  }
                  iVar41 = g->scanner_blocks;
                  if ((uVar39 & 1) != 0 && uVar39 != iVar41 - 1) {
                    if (file->binary == 0) {
                      myfprintf(file->fp,"%s","\n ");
                      iVar41 = g->scanner_blocks;
                    }
                    g->write_line = g->write_line + 1;
                  }
                  uVar39 = uVar39 + 1;
                  lVar44 = lVar44 + 8;
                } while ((long)uVar39 < (long)iVar41);
              }
              if ((file->binary == 0) && (myfprintf(file->fp,"%s","}"), file->binary == 0)) {
                pcVar53 = ",\n";
                if (uVar52 == (pSVar5->scanner).states.n - 1) {
                  pcVar53 = "\n";
                }
                myfprintf(file->fp,"}%s",pcVar53);
              }
              else {
                ppcVar47 = &(file->tables).cur;
                *ppcVar47 = *ppcVar47 + file->elem_size;
              }
              g->write_line = g->write_line + 1;
              uVar52 = uVar52 + 1;
            } while (uVar52 < (pSVar5->scanner).states.n);
          }
          end_array(file,"\n\n");
          g->write_line = g->write_line + 2;
          if ((pSVar5->field_0x178 & 0x78) != 8) {
            uVar40 = (pSVar5->scanner).states.n;
            if (uVar40 < 0xff) {
              uVar40 = (pSVar5->scanner).transitions.n;
              pcVar53 = "uint8";
              if (0xfe < uVar40) {
LAB_00133e15:
                pcVar53 = "uint16";
                if (0x7e7f < uVar40) goto LAB_00133e23;
              }
            }
            else {
              if (uVar40 < 0x7e80) {
                uVar40 = (pSVar5->scanner).transitions.n;
                goto LAB_00133e15;
              }
LAB_00133e23:
              pcVar53 = "uint32";
            }
            pcVar57 = make_name("d_transition_%d_%s",uVar42,tag);
            start_array_fn(file,0x20,"SB_trans_",pcVar53,pcVar57,"",(pSVar5->scanner).states.n,"\n")
            ;
            g->write_line = g->write_line + 1;
            uVar40 = (pSVar5->scanner).states.n;
            if (uVar40 < 0xff) {
              uVar49 = (pSVar5->scanner).transitions.n;
              local_5a0 = (Rule *)fname;
              if (0xfe < uVar49) {
LAB_00133eb4:
                local_5a0 = (Rule *)(fname + 0x28);
                if (0x7e7f < uVar49) goto LAB_00133ec9;
              }
            }
            else {
              if (uVar40 < 0x7e80) {
                uVar49 = (pSVar5->scanner).transitions.n;
                goto LAB_00133eb4;
              }
LAB_00133ec9:
              local_5a0 = (Rule *)(fname + 0x78);
            }
            if (uVar40 != 0) {
              uVar52 = 0;
              do {
                start_struct_in_array(file);
                if (file->binary == 0) {
                  myfprintf(file->fp,"%s","{");
                }
                if (0 < g->scanner_blocks) {
                  lVar44 = 0;
                  uVar39 = 0;
                  do {
                    speculative_code._0_4_ = pSVar5->index;
                    speculative_code._4_4_ = (undefined4)uVar52;
                    speculative_code._8_4_ = (undefined4)uVar39;
                    ppSVar21 = (pSVar5->scanner).states.v;
                    lVar50 = (long)(int)speculative_code._8_4_ * (long)g->scanner_block_size;
                    speculative_code._16_8_ = ppSVar21[uVar52]->chars + lVar50;
                    speculative_code._24_8_ = ppSVar21[uVar52]->transition + lVar50;
                    puVar22 = (uint *)set_add_fn(local_5a0,speculative_code,&trans_scanner_block_fns
                                                );
                    if (puVar22 == (uint *)speculative_code) {
                      __assert_fail("yv != xv",
                                    "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                                    ,0x345,"void write_scanner_data(File *, Grammar *, char *)");
                    }
                    pcVar53 = (file->tables).cur;
                    if (pcVar53 == (char *)0x0) {
                      pOVar35 = get_offset(file,"d_accepts_diff_%d_%d_%d_%s",(ulong)*puVar22,
                                           (ulong)puVar22[1],(ulong)puVar22[2],tag);
                      ppvVar43 = (void **)0x0;
                    }
                    else {
                      ppvVar43 = (void **)(pcVar53 + lVar44);
                      pOVar35 = get_offset(file,"d_accepts_diff_%d_%d_%d_%s",(ulong)*puVar22,
                                           (ulong)puVar22[1],(ulong)puVar22[2],tag);
                    }
                    add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
                    iVar41 = g->scanner_blocks;
                    if ((uVar39 & 1) != 0 && uVar39 != iVar41 - 1) {
                      if (file->binary == 0) {
                        myfprintf(file->fp,"%s","\n ");
                        iVar41 = g->scanner_blocks;
                      }
                      g->write_line = g->write_line + 1;
                    }
                    uVar39 = uVar39 + 1;
                    lVar44 = lVar44 + 8;
                  } while ((long)uVar39 < (long)iVar41);
                }
                if ((file->binary == 0) && (myfprintf(file->fp,"%s","}"), file->binary == 0)) {
                  pcVar53 = ",\n";
                  if (uVar52 == (pSVar5->scanner).states.n - 1) {
                    pcVar53 = "\n";
                  }
                  myfprintf(file->fp,"}%s",pcVar53);
                }
                else {
                  ppcVar47 = &(file->tables).cur;
                  *ppcVar47 = *ppcVar47 + file->elem_size;
                }
                g->write_line = g->write_line + 1;
                uVar52 = uVar52 + 1;
              } while (uVar52 < (pSVar5->scanner).states.n);
            }
            end_array(file,"\n\n");
            g->write_line = g->write_line + 2;
          }
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < (g->states).n);
    }
  }
  pcVar53 = fname + 0x10;
  lVar44 = 4;
  pcVar57 = pass_code + 0x10;
  do {
    pcVar19 = *(char **)(pcVar57 + -8);
    if (pcVar57 != pcVar19 && pcVar19 != (char *)0x0) {
      free(pcVar19);
    }
    pcVar57[-0x10] = '\0';
    pcVar57[-0xf] = '\0';
    pcVar57[-0xe] = '\0';
    pcVar57[-0xd] = '\0';
    pcVar57[-8] = '\0';
    pcVar57[-7] = '\0';
    pcVar57[-6] = '\0';
    pcVar57[-5] = '\0';
    pcVar57[-4] = '\0';
    pcVar57[-3] = '\0';
    pcVar57[-2] = '\0';
    pcVar57[-1] = '\0';
    pcVar19 = *(char **)(pcVar53 + -8);
    if (pcVar53 != pcVar19 && pcVar19 != (char *)0x0) {
      free(pcVar19);
    }
    pcVar53[-0x10] = '\0';
    pcVar53[-0xf] = '\0';
    pcVar53[-0xe] = '\0';
    pcVar53[-0xd] = '\0';
    pcVar53[-8] = '\0';
    pcVar53[-7] = '\0';
    pcVar53[-6] = '\0';
    pcVar53[-5] = '\0';
    pcVar53[-4] = '\0';
    pcVar53[-3] = '\0';
    pcVar53[-2] = '\0';
    pcVar53[-1] = '\0';
    pcVar53 = pcVar53 + 0x28;
    pcVar57 = pcVar57 + 0x28;
    lVar44 = lVar44 + -1;
  } while (lVar44 != 0);
  if (local_130 != local_128 && local_130 != (undefined1 *)0x0) {
    free(local_130);
  }
  free(pvVar17);
  uVar40 = (g->states).n;
  if (file->binary == 0) {
    if (uVar40 == 0) {
      uVar40 = 0;
    }
    else {
      pFVar27 = (FILE *)file->fp;
      uVar42 = 0;
      do {
        pSVar5 = (g->states).v[uVar42];
        uVar40 = (pSVar5->shift_actions).n;
        if (uVar40 != 0) {
          uVar52 = 0;
          do {
            pAVar7 = (pSVar5->shift_actions).v[uVar52];
            if ((pAVar7->kind == ACTION_SHIFT) && (pAVar7->term->kind == TERM_CODE)) {
              if ((pSVar5->field_0x178 & 2) == 0) {
                pSVar5->field_0x178 = pSVar5->field_0x178 | 2;
                pcVar53 = make_name("d_scan_code_%d_%s",uVar42 & 0xffffffff,tag);
                new_offset(file,pcVar53);
                myfprintf((FILE *)pFVar27,
                          "int d_scan_code_%d_%s(d_loc_t *loc,unsigned short *symbol, int *term_priority,unsigned char *op_assoc, int *op_priority) {\n  int res;\n"
                          ,uVar42 & 0xffffffff,tag);
                g->write_line = g->write_line + 1;
              }
              myfprintf((FILE *)pFVar27,"  if ((res = ");
              pcVar53 = pAVar7->term->string;
              sVar23 = strlen(pcVar53);
              uVar39 = (ulong)((int)sVar23 - 1);
              if (pcVar53[uVar39] == ')') {
                fwrite(pcVar53,uVar39,1,pFVar27);
                myfprintf((FILE *)pFVar27,", ");
              }
              else {
                myfprintf((FILE *)pFVar27,"%s(",pcVar53);
              }
              myfprintf((FILE *)pFVar27,
                        "loc, op_assoc, op_priority))) {\n    *symbol = %d;\n    *term_priority = %d;\n    return res;\n  }\n"
                        ,(ulong)((g->productions).n + pAVar7->term->index),
                        (ulong)(uint)pAVar7->term->term_priority);
              g->write_line = g->write_line + 1;
              uVar40 = (pSVar5->shift_actions).n;
            }
            uVar52 = uVar52 + 1;
          } while (uVar52 < uVar40);
        }
        if ((pSVar5->field_0x178 & 2) != 0) {
          myfprintf((FILE *)pFVar27,"  return 0;\n}\n\n");
          g->write_line = g->write_line + 3;
        }
        uVar42 = uVar42 + 1;
        uVar40 = (g->states).n;
      } while (uVar42 < uVar40);
    }
  }
  uVar49 = (g->productions).n + (g->terminals).n + 7;
  uVar55 = uVar49 >> 3;
  pvVar17 = malloc((ulong)uVar55);
  final_code[0] = '\0';
  final_code[1] = '\0';
  final_code[2] = '\0';
  final_code[3] = '\0';
  final_code[8] = '\0';
  final_code[9] = '\0';
  final_code[10] = '\0';
  final_code[0xb] = '\0';
  final_code[0xc] = '\0';
  final_code[0xd] = '\0';
  final_code[0xe] = '\0';
  final_code[0xf] = '\0';
  if (uVar40 == 0) {
LAB_00134c42:
    pcVar53 = make_name("d_gotos_%s",tag);
    start_array_fn(file,2,"","unsigned short",pcVar53,"",1,"");
    if (file->binary == 0) {
      myfprintf(file->fp,"%d%s",0,"");
    }
    else {
      file->n_elems = file->n_elems + 1;
      make_room_in_buf(&file->tables,(long)file->elem_size);
      pcVar53 = (file->tables).cur;
      pcVar53[0] = '\0';
      pcVar53[1] = '\0';
      (file->tables).cur = pcVar53 + file->elem_size;
    }
    end_array(file,"\n");
    iVar41 = 1;
  }
  else {
    uVar42 = 1;
    if (1 < uVar55) {
      uVar42 = (ulong)uVar55;
    }
    uVar52 = 0;
    do {
      pSVar5 = (g->states).v[uVar52];
      uVar39 = (ulong)(pSVar5->gotos).n;
      if (uVar39 == 0) {
        pSVar5->goto_table_offset = -0x7fffffff;
      }
      else {
        ppGVar24 = (pSVar5->gotos).v;
        uVar58 = 0;
        do {
          pEVar8 = ppGVar24[uVar58]->elem;
          if ((pEVar8->kind == ELEM_TERM) && (((pEVar8->e).term)->kind == TERM_TOKEN)) {
            pSVar5->field_0x178 = pSVar5->field_0x178 | 4;
          }
          uVar58 = uVar58 + 1;
        } while (uVar39 != uVar58);
        pGVar9 = *ppGVar24;
        memset(pvVar17,0,(ulong)uVar55);
        uVar56 = elem_symbol(g,pGVar9->elem);
        pbVar1 = (byte *)((long)pvVar17 + (ulong)(uVar56 >> 3));
        *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar56 & 7));
        uVar40 = (pSVar5->gotos).n;
        if (1 < uVar40) {
          uVar39 = 1;
          do {
            uVar14 = elem_symbol(g,(pSVar5->gotos).v[uVar39]->elem);
            pbVar1 = (byte *)((long)pvVar17 + (ulong)(uVar14 >> 3));
            *pbVar1 = *pbVar1 | (byte)(1 << ((byte)uVar14 & 7));
            if (uVar14 < uVar56) {
              uVar56 = uVar14;
            }
            uVar39 = uVar39 + 1;
            uVar40 = (pSVar5->gotos).n;
          } while (uVar39 < uVar40);
        }
        if (0 < (int)uVar40) {
LAB_00134501:
          ppGVar24 = (pSVar5->gotos).v;
          lVar50 = 1;
          lVar44 = 0;
          do {
            uVar14 = elem_symbol(g,ppGVar24[lVar44]->elem);
            uVar40 = uVar14 - uVar56;
            while ((uint)final_code._0_4_ <= uVar40) {
              if (final_code._8_8_ == 0) {
                uVar39 = (ulong)(uint)final_code._0_4_;
                final_code._0_4_ = final_code._0_4_ + 1;
                pcVar53 = final_code + uVar39 * 8 + 0x10;
                pcVar53[0] = '\0';
                pcVar53[1] = '\0';
                pcVar53[2] = '\0';
                pcVar53[3] = '\0';
                pcVar53[4] = '\0';
                pcVar53[5] = '\0';
                pcVar53[6] = '\0';
                pcVar53[7] = '\0';
                final_code._8_8_ = final_code + 0x10;
              }
              else if ((char *)final_code._8_8_ == final_code + 0x10) {
                if (2 < (uint)final_code._0_4_) goto LAB_0013457d;
LAB_00134568:
                uVar39 = (ulong)(uint)final_code._0_4_;
                final_code._0_4_ = final_code._0_4_ + 1;
                *(undefined8 *)(final_code._8_8_ + uVar39 * 8) = 0;
              }
              else {
                if ((final_code._0_4_ & 7) != 0) goto LAB_00134568;
LAB_0013457d:
                vec_add_internal(final_code,(void *)0x0);
              }
            }
            if (*(long *)(final_code._8_8_ + (ulong)uVar40 * 8) != 0) goto LAB_001345cc;
            ppGVar24 = (pSVar5->gotos).v;
            *(ulong *)(final_code._8_8_ + (ulong)uVar40 * 8) =
                 (ulong)(ppGVar24[lVar44]->state->index + 1);
            lVar44 = lVar44 + 1;
            lVar50 = lVar50 + 1;
            if ((int)(pSVar5->gotos).n <= lVar44) break;
          } while( true );
        }
LAB_0013462a:
        pSVar5->goto_table_offset = uVar56;
        pcVar53 = make_name("d_goto_valid_%d_%s",uVar52,tag);
        start_array_fn(file,1,"","unsigned char",pcVar53,"",0,"");
        if (file->binary == 0) {
          myfprintf(file->fp,"%s","\n");
        }
        g->write_line = g->write_line + 1;
        if (7 < uVar49) {
          uVar39 = 0;
          do {
            if (file->binary == 0) {
              pcVar53 = ",";
              if (uVar55 - 1 == uVar39) {
                pcVar53 = "";
              }
              myfprintf(file->fp,"0x%x%s",(ulong)*(byte *)((long)pvVar17 + uVar39),pcVar53);
            }
            else {
              file->n_elems = file->n_elems + 1;
              make_room_in_buf(&file->tables,(long)file->elem_size);
              *(file->tables).cur = *(char *)((long)pvVar17 + uVar39);
              ppcVar47 = &(file->tables).cur;
              *ppcVar47 = *ppcVar47 + file->elem_size;
            }
            uVar39 = uVar39 + 1;
          } while (uVar42 != uVar39);
        }
        end_array(file,"\n");
        g->write_line = g->write_line + 1;
      }
      if ((pSVar5->reduce_actions).n != 0) {
        pcVar53 = make_name("d_reductions_%d_%s",uVar52,tag);
        start_array_fn(file,8,"","D_Reduction *",pcVar53,"",0,"");
        if ((pSVar5->reduce_actions).n != 0) {
          uVar39 = 0;
          do {
            pRVar33 = (pSVar5->reduce_actions).v[uVar39]->rule;
            pRVar32 = pRVar33->same_reduction;
            if (pRVar32 == (Rule *)0x0) {
              pRVar32 = pRVar33;
            }
            pOVar35 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar32->index,tag);
            add_array_ptr_member_fn
                      (file,pOVar35,"&%s%s",(uint)(uVar39 == (pSVar5->reduce_actions).n - 1));
            uVar39 = uVar39 + 1;
          } while (uVar39 < (pSVar5->reduce_actions).n);
        }
        end_array(file,"\n");
        g->write_line = g->write_line + 1;
      }
      if ((pSVar5->right_epsilon_hints).n != 0) {
        pcVar53 = make_name("d_right_epsilon_hints_%d_%s",uVar52,tag);
        start_array_fn(file,0x10,"","D_RightEpsilonHint",pcVar53,"",0,"");
        if ((pSVar5->right_epsilon_hints).n != 0) {
          uVar39 = 0;
          do {
            start_struct_in_array(file);
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)(pSVar5->right_epsilon_hints).v[uVar39]->depth);
              if (file->binary != 0) {
                pHVar26 = (pSVar5->right_epsilon_hints).v[uVar39];
                pcVar53 = (file->tables).cur;
                goto LAB_0013492a;
              }
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)(pSVar5->right_epsilon_hints).v[uVar39]->state->index);
              pcVar53 = (file->tables).cur;
              pHVar26 = (pSVar5->right_epsilon_hints).v[uVar39];
              if (pcVar53 != (char *)0x0) goto LAB_00134936;
              pRVar33 = pHVar26->rule->same_reduction;
              if (pRVar33 == (Rule *)0x0) {
                pRVar33 = pHVar26->rule;
              }
              pOVar35 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar33->index,tag);
              ppvVar43 = (void **)0x0;
            }
            else {
              pHVar26 = (pSVar5->right_epsilon_hints).v[uVar39];
              pcVar53 = (file->tables).cur;
              *(short *)pcVar53 = (short)pHVar26->depth;
LAB_0013492a:
              *(short *)(pcVar53 + 2) = (short)pHVar26->state->index;
LAB_00134936:
              ppvVar43 = (void **)(pcVar53 + 8);
              pRVar33 = pHVar26->rule->same_reduction;
              if (pRVar33 == (Rule *)0x0) {
                pRVar33 = pHVar26->rule;
              }
              pOVar35 = get_offset(file,"d_reduction_%d_%s",(ulong)pRVar33->index,tag);
            }
            add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"&%s");
            if (file->binary == 0) {
              pcVar53 = ",";
              if (uVar39 == (pSVar5->right_epsilon_hints).n - 1) {
                pcVar53 = "";
              }
              myfprintf(file->fp,"}%s",pcVar53);
            }
            else {
              ppcVar47 = &(file->tables).cur;
              *ppcVar47 = *ppcVar47 + file->elem_size;
            }
            uVar39 = uVar39 + 1;
          } while (uVar39 < (pSVar5->right_epsilon_hints).n);
        }
        end_array(file,"\n");
        g->write_line = g->write_line + 1;
      }
      uVar52 = uVar52 + 1;
    } while (uVar52 < (g->states).n);
    if (final_code._0_4_ == 0) goto LAB_00134c42;
    pcVar53 = make_name("d_gotos_%s",tag);
    iVar41 = 2;
    start_array_fn(file,2,"","unsigned short",pcVar53,"",final_code._0_4_,"\n");
    g->write_line = g->write_line + 1;
    if (final_code._0_4_ != 0) {
      uVar42 = 0;
      do {
        if (0xffff < *(ulong *)(final_code._8_8_ + uVar42 * 8)) {
          d_fail("goto table overflow");
        }
        if (file->binary == 0) {
          pcVar53 = ",";
          if (uVar42 == final_code._0_4_ - 1) {
            pcVar53 = "";
          }
          myfprintf(file->fp,"%d%s",*(undefined8 *)(final_code._8_8_ + uVar42 * 8),pcVar53);
        }
        else {
          file->n_elems = file->n_elems + 1;
          make_room_in_buf(&file->tables,(long)file->elem_size);
          pcVar53 = (file->tables).cur;
          *(undefined2 *)pcVar53 = *(undefined2 *)(final_code._8_8_ + uVar42 * 8);
          (file->tables).cur = pcVar53 + file->elem_size;
        }
        if ((~(uint)uVar42 & 0xf) == 0) {
          if (file->binary == 0) {
            myfprintf(file->fp,"%s","\n");
          }
          g->write_line = g->write_line + 1;
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < (uint)final_code._0_4_);
    }
    end_array(file,"\n\n");
  }
  g->write_line = g->write_line + iVar41;
  if ((char *)final_code._8_8_ != final_code + 0x10 && final_code._8_8_ != 0) {
    free((void *)final_code._8_8_);
  }
  free(pvVar17);
  if ((g->states).n != 0) {
    uVar42 = 0;
    do {
      pSVar5 = (g->states).v[uVar42];
      if (((pSVar5->error_recovery_hints).n != 0) &&
         (pSVar25 = (State *)set_add_fn(&er_hash,pSVar5,&er_hint_hash_fns), pSVar25 == pSVar5)) {
        pcVar53 = make_name("d_error_recovery_hints_%d_%s",uVar42 & 0xffffffff,tag);
        start_array_fn(file,0x10,"","D_ErrorRecoveryHint",pcVar53,"",0,"");
        if (file->binary == 0) {
          pcVar53 = "";
          if (1 < (pSVar5->error_recovery_hints).n) {
            pcVar53 = "\n";
          }
          myfprintf(file->fp,"%s",pcVar53);
        }
        if ((pSVar5->error_recovery_hints).n != 0) {
          uVar52 = 0;
          do {
            pRVar33 = (pSVar5->error_recovery_hints).v[uVar52]->rule;
            pcVar53 = escape_string((((pRVar33->elems).v[(pRVar33->elems).n - 1]->e).term)->string);
            start_struct_in_array(file);
            if (file->binary == 0) {
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",(ulong)(pSVar5->error_recovery_hints).v[uVar52]->depth);
              if (file->binary != 0) {
                pHVar26 = (pSVar5->error_recovery_hints).v[uVar52];
                pcVar57 = (file->tables).cur;
                goto LAB_00134ea7;
              }
              if (file->first_member == 0) {
                myfprintf(file->fp,", ");
              }
              file->first_member = 0;
              myfprintf(file->fp,"%d",
                        (ulong)(pSVar5->error_recovery_hints).v[uVar52]->rule->prod->index);
              pcVar57 = (file->tables).cur;
              if (pcVar57 != (char *)0x0) goto LAB_00134eb7;
              ppcVar47 = (char **)0x0;
            }
            else {
              pHVar26 = (pSVar5->error_recovery_hints).v[uVar52];
              pcVar57 = (file->tables).cur;
              *(short *)pcVar57 = (short)pHVar26->depth;
LAB_00134ea7:
              *(short *)(pcVar57 + 2) = (short)pHVar26->rule->prod->index;
LAB_00134eb7:
              ppcVar47 = (char **)(pcVar57 + 8);
            }
            add_struct_str_member_fn(file,ppcVar47,pcVar53);
            if (file->binary == 0) {
              pcVar57 = ",\n";
              if (uVar52 == (pSVar5->error_recovery_hints).n - 1) {
                pcVar57 = "";
              }
              myfprintf(file->fp,"}%s",pcVar57);
            }
            else {
              ppcVar47 = &(file->tables).cur;
              *ppcVar47 = *ppcVar47 + file->elem_size;
            }
            if (uVar52 != (pSVar5->error_recovery_hints).n - 1) {
              g->write_line = g->write_line + 1;
            }
            free(pcVar53);
            uVar52 = uVar52 + 1;
          } while (uVar52 < (pSVar5->error_recovery_hints).n);
        }
        end_array(file,"\n");
        g->write_line = g->write_line + 1;
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < (g->states).n);
  }
  if (file->binary == 0) {
    myfprintf(file->fp,"%s","\n");
  }
  pcVar53 = make_name("d_states_%s",tag);
  start_array_fn(file,0x78,"","D_State",pcVar53,"",0,"");
  if ((g->states).n == 0) {
    if (file->binary == 0) {
      myfprintf(file->fp,"{{0, {0, NULL}, 0, NULL}};\n\n");
    }
    else {
      d_fail("no states\n");
    }
  }
  else {
    if ((file->binary != 0) || (myfprintf(file->fp,"%s","\n"), (g->states).n != 0)) {
      uVar42 = 0;
      do {
        pSVar5 = (g->states).v[uVar42];
        pSVar25 = pSVar5->same_shifts;
        if (pSVar5->same_shifts == (State *)0x0) {
          pSVar25 = pSVar5;
        }
        start_struct_in_array(file);
        ppvVar43 = (void **)(file->tables).cur;
        if ((pSVar5->gotos).n == 0) {
          if (ppvVar43 == (void **)0x0) {
            ppvVar43 = (void **)0x0;
          }
          pOVar35 = &null_entry;
        }
        else {
          pOVar35 = get_offset(file,"d_goto_valid_%d_%s",uVar42 & 0xffffffff,tag);
          if (ppvVar43 == (void **)0x0) {
            ppvVar43 = (void **)0x0;
          }
        }
        add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          bVar60 = false;
          myfprintf(file->fp,"%d",(ulong)(uint)pSVar5->goto_table_offset);
          if (file->binary == 0) {
            myfprintf(file->fp,"%s",", {");
            file->first_member = 1;
            bVar60 = file->binary == 0;
          }
        }
        else {
          *(int *)((file->tables).cur + 8) = pSVar5->goto_table_offset;
          bVar60 = false;
        }
        uVar40 = (pSVar5->reduce_actions).n;
        if (uVar40 == 0) {
          if (bVar60) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",0);
            pcVar53 = (file->tables).cur;
            if (pcVar53 != (char *)0x0) goto LAB_001352a6;
            ppvVar43 = (void **)0x0;
          }
          else {
            pcVar53 = (file->tables).cur;
            pcVar53[0x10] = '\0';
            pcVar53[0x11] = '\0';
            pcVar53[0x12] = '\0';
            pcVar53[0x13] = '\0';
LAB_001352a6:
            ppvVar43 = (void **)(pcVar53 + 0x18);
          }
          pOVar35 = &null_entry;
        }
        else {
          if (bVar60) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
              uVar40 = (pSVar5->reduce_actions).n;
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",(ulong)uVar40);
            pcVar53 = (file->tables).cur;
            if (pcVar53 == (char *)0x0) {
              pOVar35 = get_offset(file,"d_reductions_%d_%s",uVar42 & 0xffffffff,tag);
              ppvVar43 = (void **)0x0;
              goto LAB_001352b4;
            }
          }
          else {
            pcVar53 = (file->tables).cur;
            *(uint *)(pcVar53 + 0x10) = uVar40;
          }
          ppvVar43 = (void **)(pcVar53 + 0x18);
          pOVar35 = get_offset(file,"d_reductions_%d_%s",uVar42 & 0xffffffff,tag);
        }
LAB_001352b4:
        add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
        if (file->binary == 0) {
          bVar60 = false;
          myfprintf(file->fp,"%s","}, ");
          if (file->binary == 0) {
            myfprintf(file->fp,"%s","{");
            file->first_member = 1;
            bVar60 = file->binary == 0;
          }
        }
        else {
          bVar60 = false;
        }
        uVar40 = (pSVar5->right_epsilon_hints).n;
        if (uVar40 == 0) {
          if (bVar60) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",0);
            pcVar53 = (file->tables).cur;
            if (pcVar53 != (char *)0x0) goto LAB_00135430;
            ppvVar43 = (void **)0x0;
          }
          else {
            pcVar53 = (file->tables).cur;
            pcVar53[0x20] = '\0';
            pcVar53[0x21] = '\0';
            pcVar53[0x22] = '\0';
            pcVar53[0x23] = '\0';
LAB_00135430:
            ppvVar43 = (void **)(pcVar53 + 0x28);
          }
          pOVar35 = &null_entry;
        }
        else {
          if (bVar60) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
              uVar40 = (pSVar5->right_epsilon_hints).n;
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",(ulong)uVar40);
            pcVar53 = (file->tables).cur;
            if (pcVar53 == (char *)0x0) {
              pOVar35 = get_offset(file,"d_right_epsilon_hints_%d_%s",uVar42 & 0xffffffff,tag);
              ppvVar43 = (void **)0x0;
              goto LAB_0013543e;
            }
          }
          else {
            pcVar53 = (file->tables).cur;
            *(uint *)(pcVar53 + 0x20) = uVar40;
          }
          ppvVar43 = (void **)(pcVar53 + 0x28);
          pOVar35 = get_offset(file,"d_right_epsilon_hints_%d_%s",uVar42 & 0xffffffff,tag);
        }
LAB_0013543e:
        add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
        if ((file->binary == 0) && (myfprintf(file->fp,"%s","}, "), file->binary == 0)) {
          myfprintf(file->fp,"%s","{");
          file->first_member = 1;
        }
        if ((pSVar5->error_recovery_hints).n == 0) {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",0);
            pcVar53 = (file->tables).cur;
            if (pcVar53 != (char *)0x0) goto LAB_00135597;
            ppvVar43 = (void **)0x0;
          }
          else {
            pcVar53 = (file->tables).cur;
            pcVar53[0x30] = '\0';
            pcVar53[0x31] = '\0';
            pcVar53[0x32] = '\0';
            pcVar53[0x33] = '\0';
LAB_00135597:
            ppvVar43 = (void **)(pcVar53 + 0x38);
          }
          pOVar35 = &null_entry;
        }
        else {
          puVar22 = (uint *)set_add_fn(&er_hash,pSVar5,&er_hint_hash_fns);
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            myfprintf(file->fp,"%d",(ulong)(pSVar5->error_recovery_hints).n);
            pcVar53 = (file->tables).cur;
            if (pcVar53 == (char *)0x0) {
              pOVar35 = get_offset(file,"d_error_recovery_hints_%d_%s",(ulong)*puVar22,tag);
              ppvVar43 = (void **)0x0;
              goto LAB_001355a5;
            }
          }
          else {
            pcVar53 = (file->tables).cur;
            *(uint *)(pcVar53 + 0x30) = (pSVar5->error_recovery_hints).n;
          }
          ppvVar43 = (void **)(pcVar53 + 0x38);
          pOVar35 = get_offset(file,"d_error_recovery_hints_%d_%s",(ulong)*puVar22,tag);
        }
LAB_001355a5:
        add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
        if (file->binary == 0) {
          myfprintf(file->fp,"%s","}");
        }
        if ((((pSVar5->shift_actions).n == 0) && ((pSVar5->field_0x178 & 2) == 0)) &&
           (((pSVar5->field_0x178 & 4) == 0 || ((g->scanner).code == (char *)0x0)))) {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            pFVar51 = file->fp;
            uVar37 = 0;
LAB_00135643:
            myfprintf(pFVar51,"%d",uVar37);
          }
          else {
            pcVar53 = (file->tables).cur;
            pcVar53[0x40] = '\0';
            pcVar53[0x41] = '\0';
            pcVar53[0x42] = '\0';
            pcVar53[0x43] = '\0';
          }
        }
        else {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            pFVar51 = file->fp;
            uVar37 = 1;
            goto LAB_00135643;
          }
          pcVar53 = (file->tables).cur;
          pcVar53[0x40] = '\x01';
          pcVar53[0x41] = '\0';
          pcVar53[0x42] = '\0';
          pcVar53[0x43] = '\0';
        }
        if ((g->scanner).code == (char *)0x0) {
          pcVar53 = (file->tables).cur;
          if ((pSVar5->field_0x178 & 2) == 0) {
            if (pcVar53 == (char *)0x0) {
              ppvVar43 = (void **)0x0;
            }
            else {
              ppvVar43 = (void **)(pcVar53 + 0x48);
            }
            pOVar35 = &null_entry;
          }
          else if (pcVar53 == (char *)0x0) {
            pOVar35 = get_offset(file,"d_scan_code_%d_%s",uVar42 & 0xffffffff,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar53 + 0x48);
            pOVar35 = get_offset(file,"d_scan_code_%d_%s",uVar42 & 0xffffffff,tag);
          }
LAB_00135760:
          add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
        }
        else {
          if ((pSVar5->field_0x178 & 4) == 0) {
            pcVar53 = (file->tables).cur;
            if (pcVar53 == (char *)0x0) {
              ppvVar43 = (void **)0x0;
            }
            else {
              ppvVar43 = (void **)(pcVar53 + 0x48);
            }
            pOVar35 = &null_entry;
            goto LAB_00135760;
          }
          if (file->binary != 0) {
            __assert_fail("!fp->binary",
                          "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                          ,0x5dd,"void write_state_data(File *, Grammar *, VecState *, char *)");
          }
          myfprintf(file->fp,", %s");
        }
        if ((pSVar5->scanner).states.n == 0) {
          pcVar53 = (file->tables).cur;
          if (pcVar53 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar53 + 0x50);
          }
          pOVar35 = &null_entry;
        }
        else {
          if (file->binary == 0) {
            myfprintf(file->fp,"%s",", (void*)");
            file->first_member = 1;
          }
          pcVar53 = (file->tables).cur;
          if (pcVar53 == (char *)0x0) {
            pOVar35 = get_offset(file,"d_scanner_%d_%s",(ulong)pSVar25->index,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar53 + 0x50);
            pOVar35 = get_offset(file,"d_scanner_%d_%s",(ulong)pSVar25->index,tag);
          }
        }
        add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
        if (file->binary == 0) {
          uVar40 = (pSVar5->scanner).states.n;
          if (uVar40 < 0xff) {
            uVar40 = (pSVar5->scanner).transitions.n;
            pcVar53 = "unsigned char";
            if (0xfe < uVar40) {
LAB_00135890:
              pcVar53 = "unsigned short";
              if (0x7e7f < uVar40) goto LAB_0013589e;
            }
          }
          else {
            if (uVar40 < 0x7e80) {
              uVar40 = (pSVar5->scanner).transitions.n;
              goto LAB_00135890;
            }
LAB_0013589e:
            pcVar53 = "unsigned int";
          }
          myfprintf(file->fp,", sizeof(%s) ",pcVar53);
          if (file->binary != 0) {
            pcVar53 = (file->tables).cur;
            goto LAB_001358c4;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)((byte)pSVar5->field_0x178 & 1));
          if (file->binary != 0) {
            pcVar53 = (file->tables).cur;
            goto LAB_001358d2;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,*(char **)((long)scan_kind_strings +
                                       (ulong)((byte)pSVar5->field_0x178 & 0x38)));
        }
        else {
          uVar40 = (pSVar5->scanner).states.n;
          if (uVar40 < 0xff) {
            uVar40 = (pSVar5->scanner).transitions.n;
            cVar29 = '\x01';
            if (0xfe < uVar40) {
LAB_0013586d:
              cVar29 = '\x02';
              if (0x7e7f < uVar40) goto LAB_00135876;
            }
          }
          else {
            if (uVar40 < 0x7e80) {
              uVar40 = (pSVar5->scanner).transitions.n;
              goto LAB_0013586d;
            }
LAB_00135876:
            cVar29 = '\x04';
          }
          pcVar53 = (file->tables).cur;
          pcVar53[0x58] = cVar29;
LAB_001358c4:
          pcVar53[0x59] = pSVar5->field_0x178 & 1;
LAB_001358d2:
          pcVar53[0x5a] = (byte)pSVar5->field_0x178 >> 3 & 7;
        }
        if (((pSVar25->field_0x178 & 0x78) == 8) || ((pSVar25->scanner).states.n == 0)) {
          pcVar53 = (file->tables).cur;
          if (pcVar53 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar53 + 0x60);
          }
          pOVar35 = &null_entry;
        }
        else {
          if (file->binary == 0) {
            myfprintf(file->fp,"%s",", (void*)");
            file->first_member = 1;
          }
          pcVar53 = (file->tables).cur;
          if (pcVar53 == (char *)0x0) {
            pOVar35 = get_offset(file,"d_transition_%d_%s",(ulong)pSVar25->index,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar53 + 0x60);
            pOVar35 = get_offset(file,"d_transition_%d_%s",(ulong)pSVar25->index,tag);
          }
        }
        add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
        if (((pSVar25->field_0x178 & 0x78) == 8) || ((pSVar25->scanner).states.n == 0)) {
          pcVar53 = (file->tables).cur;
          if (pcVar53 == (char *)0x0) {
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar53 + 0x68);
          }
          add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
        }
        else {
          pcVar53 = (file->tables).cur;
          if (pcVar53 == (char *)0x0) {
            pOVar35 = get_offset(file,"d_accepts_diff_%d_%s",(ulong)pSVar25->index,tag);
            ppvVar43 = (void **)0x0;
          }
          else {
            ppvVar43 = (void **)(pcVar53 + 0x68);
            pOVar35 = get_offset(file,"d_accepts_diff_%d_%s",(ulong)pSVar25->index,tag);
          }
          add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
        }
        pSVar25 = pSVar5->reduces_to;
        if (pSVar25 == (State *)0x0) {
          if (file->binary == 0) {
            if (file->first_member == 0) {
              myfprintf(file->fp,", ");
            }
            file->first_member = 0;
            pFVar51 = file->fp;
            uVar52 = 0xffffffff;
            goto LAB_00135b41;
          }
          pcVar53 = (file->tables).cur;
          pcVar53[0x70] = -1;
          pcVar53[0x71] = -1;
          pcVar53[0x72] = -1;
          pcVar53[0x73] = -1;
        }
        else if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
            pSVar25 = pSVar5->reduces_to;
          }
          file->first_member = 0;
          pFVar51 = file->fp;
          uVar52 = (ulong)pSVar25->index;
LAB_00135b41:
          myfprintf(pFVar51,"%d",uVar52);
        }
        else {
          *(uint *)((file->tables).cur + 0x70) = pSVar25->index;
        }
        if (file->binary == 0) {
          pcVar53 = ",\n";
          if (uVar42 == (g->states).n - 1) {
            pcVar53 = "\n";
          }
          myfprintf(file->fp,"}%s",pcVar53);
        }
        else {
          ppcVar47 = &(file->tables).cur;
          *ppcVar47 = *ppcVar47 + file->elem_size;
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < (g->states).n);
    }
    end_array(file,"\n\n");
  }
  pcVar53 = make_name("d_symbols_%s",tag);
  start_array_fn(file,0x18,"","D_Symbol",pcVar53,"",0,"\n");
  g->write_line = g->write_line + 1;
  if ((g->productions).n != 0) {
    uVar42 = 0;
    do {
      pPVar15 = (g->productions).v[uVar42];
      uVar14 = 0xffffffff;
      if (((pPVar15->field_0x3c & 0x1c) == 0) && (pPVar15->elem != (Elem *)0x0)) {
        uVar14 = pPVar15->state->index;
      }
      start_struct_in_array(file);
      pPVar15 = (g->productions).v[uVar42];
      bVar12 = (byte)pPVar15->field_0x3c >> 2;
      uVar40 = bVar12 & 7;
      uVar52 = (ulong)uVar40;
      if (uVar40 - 2 < 2) {
        uVar52 = 2;
      }
      else if ((bVar12 & 7) != 0) {
        uVar52 = (ulong)((char)uVar40 == '\x04') + 1;
      }
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,d_internal_rel + *(int *)(d_internal_rel + uVar52 * 4));
        piVar48 = (int *)(file->tables).cur;
        pPVar15 = (g->productions).v[uVar42];
        if (piVar48 != (int *)0x0) goto LAB_00135da6;
        pcVar53 = pPVar15->name;
        ppcVar47 = (char **)0x0;
      }
      else {
        piVar48 = (int *)(file->tables).cur;
        *piVar48 = d_internal_values[uVar52];
LAB_00135da6:
        ppcVar47 = (char **)(piVar48 + 2);
        pcVar53 = pPVar15->name;
      }
      add_struct_str_member_fn(file,ppcVar47,pcVar53);
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)(g->productions).v[uVar42]->name_len);
        if (file->binary != 0) {
          pcVar53 = (file->tables).cur;
          goto LAB_00135e2b;
        }
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",(ulong)uVar14);
        if (file->binary != 0) {
          pcVar53 = (file->tables).cur;
          goto LAB_00135e2f;
        }
        myfprintf(file->fp,"}%s",",\n");
      }
      else {
        pcVar53 = (file->tables).cur;
        *(uint *)(pcVar53 + 0x10) = (g->productions).v[uVar42]->name_len;
LAB_00135e2b:
        *(uint *)(pcVar53 + 0x14) = uVar14;
LAB_00135e2f:
        (file->tables).cur = pcVar53 + file->elem_size;
      }
      g->write_line = g->write_line + 1;
      uVar42 = uVar42 + 1;
    } while (uVar42 < (g->productions).n);
  }
  if ((g->terminals).n != 0) {
    uVar42 = 0;
    do {
      pcVar57 = escape_string((g->terminals).v[uVar42]->string);
      pcVar19 = escape_string(pcVar57);
      pTVar16 = (g->terminals).v[uVar42];
      pcVar53 = pTVar16->term_name;
      if ((pcVar53 == (char *)0x0) && (pcVar53 = pcVar57, file->binary == 0)) {
        pcVar53 = pcVar19;
      }
      lVar44 = (long)(int)pTVar16->kind;
      start_struct_in_array(file);
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,d_symbol_rel + *(int *)(d_symbol_rel + lVar44 * 4));
        piVar48 = (int *)(file->tables).cur;
        if (piVar48 != (int *)0x0) goto LAB_00135f9a;
        ppcVar47 = (char **)0x0;
      }
      else {
        piVar48 = (int *)(file->tables).cur;
        *piVar48 = d_symbol_values[lVar44];
LAB_00135f9a:
        ppcVar47 = (char **)(piVar48 + 2);
      }
      add_struct_str_member_fn(file,ppcVar47,pcVar53);
      if (file->binary == 0) {
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        pFVar51 = file->fp;
        sVar23 = strlen(pcVar53);
        myfprintf(pFVar51,"%d",sVar23 & 0xffffffff);
        if (file->binary != 0) {
          pcVar53 = (file->tables).cur;
          goto LAB_0013600c;
        }
        if (file->first_member == 0) {
          myfprintf(file->fp,", ");
        }
        file->first_member = 0;
        myfprintf(file->fp,"%d",0xffffffff);
        if (file->binary != 0) {
          pcVar53 = (file->tables).cur;
          goto LAB_00136013;
        }
        myfprintf(file->fp,"}%s",",\n");
      }
      else {
        sVar23 = strlen(pcVar53);
        pcVar53 = (file->tables).cur;
        *(int *)(pcVar53 + 0x10) = (int)sVar23;
LAB_0013600c:
        pcVar53[0x14] = -1;
        pcVar53[0x15] = -1;
        pcVar53[0x16] = -1;
        pcVar53[0x17] = -1;
LAB_00136013:
        (file->tables).cur = pcVar53 + file->elem_size;
      }
      g->write_line = g->write_line + 1;
      free(pcVar57);
      free(pcVar19);
      uVar42 = uVar42 + 1;
    } while (uVar42 < (g->terminals).n);
  }
  end_array(file,"\n\n");
  g->write_line = g->write_line + 2;
  if ((g->passes).n != 0) {
    pcVar53 = make_name("d_passes_%s",tag);
    start_array_fn(file,0x18,"","D_Pass",pcVar53,"",0,"");
    g->write_line = g->write_line + 1;
    if ((g->passes).n != 0) {
      uVar42 = 0;
      do {
        pDVar10 = (g->passes).v[uVar42];
        start_struct_in_array(file);
        ppcVar47 = (char **)(file->tables).cur;
        if (ppcVar47 == (char **)0x0) {
          ppcVar47 = (char **)0x0;
        }
        add_struct_str_member_fn(file,ppcVar47,pDVar10->name);
        if (file->binary == 0) {
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)pDVar10->name_len);
          if (file->binary != 0) {
            pcVar53 = (file->tables).cur;
            goto LAB_001361e8;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"0x%x",(ulong)pDVar10->kind);
          if (file->binary != 0) {
            pcVar53 = (file->tables).cur;
            goto LAB_001361ef;
          }
          if (file->first_member == 0) {
            myfprintf(file->fp,", ");
          }
          file->first_member = 0;
          myfprintf(file->fp,"%d",(ulong)pDVar10->index);
          if (file->binary != 0) {
            pcVar53 = (file->tables).cur;
            goto LAB_001361f6;
          }
          pcVar53 = "";
          if (uVar42 < (g->passes).n - 1) {
            pcVar53 = ", ";
          }
          myfprintf(file->fp,"}%s",pcVar53);
        }
        else {
          pcVar53 = (file->tables).cur;
          *(uint *)(pcVar53 + 8) = pDVar10->name_len;
LAB_001361e8:
          *(uint *)(pcVar53 + 0xc) = pDVar10->kind;
LAB_001361ef:
          *(uint *)(pcVar53 + 0x10) = pDVar10->index;
LAB_001361f6:
          (file->tables).cur = pcVar53 + file->elem_size;
        }
        uVar42 = uVar42 + 1;
      } while (uVar42 < (g->passes).n);
    }
    end_array(file,"\n\n");
    g->write_line = g->write_line + 2;
  }
  if (er_hash.v != er_hash.e && er_hash.v != (State **)0x0) {
    free(er_hash.v);
  }
  er_hash.n = 0;
  er_hash.v = (State **)0x0;
  pPVar15 = lookup_production(g,"whitespace",10);
  if (pPVar15 == (Production *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = pPVar15->state->index;
  }
  if (file->binary != 0) {
    file->d_parser_tables_loc = *(int *)&(file->tables).cur - *(int *)&(file->tables).start;
  }
  pcVar53 = make_name("parser_tables_%s",tag);
  start_struct_fn(file,0x48,"D_ParserTables",pcVar53,"\n");
  if (file->binary == 0) {
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    myfprintf(file->fp,"%d",(ulong)(g->states).n);
    puVar59 = (uint *)(file->tables).cur;
    if (puVar59 != (uint *)0x0) goto LAB_00136408;
    pOVar35 = get_offset(file,"d_states_%s",tag);
    ppvVar43 = (void **)0x0;
  }
  else {
    puVar59 = (uint *)(file->tables).cur;
    *puVar59 = (g->states).n;
LAB_00136408:
    ppvVar43 = (void **)(puVar59 + 2);
    pOVar35 = get_offset(file,"d_states_%s",tag);
  }
  ppcVar47 = &(file->tables).cur;
  add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
  if (*ppcVar47 == (char *)0x0) {
    pOVar35 = get_offset(file,"d_gotos_%s",tag);
    ppvVar43 = (void **)0x0;
  }
  else {
    ppvVar43 = (void **)(*ppcVar47 + 0x10);
    pOVar35 = get_offset(file,"d_gotos_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
  if (file->binary == 0) {
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    myfprintf(file->fp,"%d",(ulong)uVar14);
    if (file->binary != 0) goto LAB_001364f1;
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    myfprintf(file->fp,"%d",(ulong)((g->terminals).n + (g->productions).n));
    pcVar53 = (file->tables).cur;
    if (pcVar53 != (char *)0x0) goto LAB_001364fe;
    pOVar35 = get_offset(file,"d_symbols_%s",tag);
    ppvVar43 = (void **)0x0;
  }
  else {
    *(uint *)(*ppcVar47 + 0x18) = uVar14;
LAB_001364f1:
    pcVar53 = *ppcVar47;
    *(uint *)(pcVar53 + 0x1c) = (g->terminals).n + (g->productions).n;
LAB_001364fe:
    ppvVar43 = (void **)(pcVar53 + 0x20);
    pOVar35 = get_offset(file,"d_symbols_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
  if (g->default_white_space == (char *)0x0) {
    if (*ppcVar47 == (char *)0x0) {
      ppvVar43 = (void **)0x0;
    }
    else {
      ppvVar43 = (void **)(*ppcVar47 + 0x28);
    }
    add_struct_ptr_member_fn(file,ppvVar43,&null_entry,"%s");
  }
  else {
    if (file->binary != 0) {
      __assert_fail("!file->binary",
                    "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                    ,0x6a6,"void write_parser_tables(Grammar *, char *, File *)");
    }
    myfprintf(file->fp,", %s");
  }
  if (file->binary == 0) {
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    myfprintf(file->fp,"%d",(ulong)(g->passes).n);
    uVar14 = (g->passes).n;
  }
  else {
    uVar14 = (g->passes).n;
    *(uint *)(*ppcVar47 + 0x30) = uVar14;
  }
  pcVar53 = *ppcVar47;
  if (uVar14 == 0) {
    if (pcVar53 == (char *)0x0) {
      pOVar35 = &null_entry;
      ppvVar43 = (void **)0x0;
    }
    else {
      ppvVar43 = (void **)(pcVar53 + 0x38);
      pOVar35 = &null_entry;
    }
  }
  else if (pcVar53 == (char *)0x0) {
    pOVar35 = get_offset(file,"d_passes_%s",tag);
    ppvVar43 = (void **)0x0;
  }
  else {
    ppvVar43 = (void **)(pcVar53 + 0x38);
    pOVar35 = get_offset(file,"d_passes_%s",tag);
  }
  add_struct_ptr_member_fn(file,ppvVar43,pOVar35,"%s");
  if (g->save_parse_tree == 0) {
    if (file->binary == 0) {
      if (file->first_member == 0) {
        myfprintf(file->fp,", ");
      }
      file->first_member = 0;
      pFVar51 = file->fp;
      uVar37 = 0;
      goto LAB_0013680e;
    }
    pcVar53 = *ppcVar47;
    pcVar53[0x40] = '\0';
    pcVar53[0x41] = '\0';
    pcVar53[0x42] = '\0';
    pcVar53[0x43] = '\0';
  }
  else if (file->binary == 0) {
    if (file->first_member == 0) {
      myfprintf(file->fp,", ");
    }
    file->first_member = 0;
    pFVar51 = file->fp;
    uVar37 = 1;
LAB_0013680e:
    myfprintf(pFVar51,"%d",uVar37);
  }
  else {
    pcVar53 = *ppcVar47;
    pcVar53[0x40] = '\x01';
    pcVar53[0x41] = '\0';
    pcVar53[0x42] = '\0';
    pcVar53[0x43] = '\0';
  }
  if (file->binary == 0) {
    myfprintf(file->fp,"};%s","\n");
    if (file->binary == 0) goto LAB_001369b9;
  }
  else {
    *ppcVar47 = *ppcVar47 + 0x48;
  }
  if (file->str == (uint8 **)0x0) {
    pFVar27 = fopen(g->write_pathname,"wb");
    file->fp = (FILE *)pFVar27;
    if (pFVar27 == (FILE *)0x0) {
      d_fail("unable to open `%s` for write\n",g->pathname);
    }
  }
  final_code._0_4_ = (file->relocations).n;
  final_code._4_4_ = (file->str_relocations).n;
  lVar44 = (long)(file->tables).cur - (long)(file->tables).start;
  uVar34 = (undefined4)lVar44;
  final_code[0xc] = (char)uVar34;
  final_code[0xd] = (char)((uint)uVar34 >> 8);
  final_code[0xe] = (char)((uint)uVar34 >> 0x10);
  final_code[0xf] = (char)((uint)uVar34 >> 0x18);
  final_code._8_4_ = file->d_parser_tables_loc;
  lVar50 = (long)(file->strings).cur - (long)(file->strings).start;
  final_code._16_4_ = (undefined4)lVar50;
  ppuVar11 = file->str;
  if (ppuVar11 != (uint8 **)0x0) {
    uVar42 = lVar50 + lVar44 + ((ulong)(uint)final_code._4_4_ + (ulong)(uint)final_code._0_4_) * 8 +
             0x14;
    puVar28 = (uint8 *)malloc(uVar42 & 0xffffffff);
    *ppuVar11 = puVar28;
    file->cur_str = puVar28;
    *file->str_len = (uint)uVar42;
  }
  write_chk(final_code,0x14,1,file);
  write_chk((file->tables).start,1,(long)(int)final_code._12_4_,file);
  write_chk((file->strings).start,1,(long)(int)final_code._16_4_,file);
  if ((file->relocations).n != 0) {
    lVar44 = 0;
    uVar42 = 0;
    do {
      write_chk((void *)((long)(file->relocations).v + lVar44),8,1,file);
      uVar42 = uVar42 + 1;
      lVar44 = lVar44 + 8;
    } while (uVar42 < (file->relocations).n);
  }
  if ((file->str_relocations).n != 0) {
    lVar44 = 0;
    uVar42 = 0;
    do {
      write_chk((void *)((long)(file->str_relocations).v + lVar44),8,1,file);
      uVar42 = uVar42 + 1;
      lVar44 = lVar44 + 8;
    } while (uVar42 < (file->str_relocations).n);
  }
LAB_001369b9:
  pcVar53 = (file->tables).start;
  if (pcVar53 != (char *)0x0) {
    free(pcVar53);
  }
  pcVar53 = (file->strings).start;
  if (pcVar53 != (char *)0x0) {
    free(pcVar53);
  }
  ppcVar47 = (file->str_relocations).v;
  if (ppcVar47 != (file->str_relocations).e && ppcVar47 != (char **)0x0) {
    free(ppcVar47);
  }
  (file->str_relocations).n = 0;
  (file->str_relocations).v = (char **)0x0;
  ppcVar47 = (file->relocations).v;
  if (ppcVar47 != (file->relocations).e && ppcVar47 != (char **)0x0) {
    free(ppcVar47);
  }
  (file->relocations).n = 0;
  (file->relocations).v = (char **)0x0;
  uVar40 = (file->entries).n;
  if (uVar40 != 0) {
    uVar42 = 0;
    do {
      pOVar35 = (file->entries).v[uVar42];
      if (pOVar35 != (OffsetEntry *)0x0) {
        free(pOVar35->name);
        free((file->entries).v[uVar42]);
        (file->entries).v[uVar42] = (OffsetEntry *)0x0;
        uVar40 = (file->entries).n;
      }
      uVar42 = uVar42 + 1;
    } while (uVar42 < uVar40);
  }
  __ptr = (file->entries).v;
  if (__ptr != (file->entries).e && __ptr != (OffsetEntry **)0x0) {
    free(__ptr);
  }
  (file->entries).n = 0;
  (file->entries).v = (OffsetEntry **)0x0;
  if ((FILE *)file->fp != (FILE *)0x0) {
    fclose((FILE *)file->fp);
  }
  return;
LAB_001345cc:
  if (lVar44 != 0) {
    do {
      uVar14 = elem_symbol(g,(pSVar5->gotos).v[(int)lVar50 - 2]->elem);
      *(undefined8 *)(final_code._8_8_ + (ulong)(uVar14 - uVar56) * 8) = 0;
      lVar50 = lVar50 + -1;
    } while (1 < lVar50);
  }
  uVar56 = uVar56 - 1;
  if ((int)(pSVar5->gotos).n < 1) goto LAB_0013462a;
  goto LAB_00134501;
}

Assistant:

void write_parser_tables(Grammar *g, char *tag, File *file) {
  int whitespace_production = 0;
  VecState er_hash;
  Production *p;
  vec_clear(&er_hash);

  g->scanner_block_size = 256 / g->scanner_blocks;

  write_reductions(file, g, tag);
  write_scanner_data(file, g, tag);
  if (!file->binary) write_scanner_code(file, g, tag);
  write_goto_data(file, g, tag);
  write_error_data(file, g, &er_hash, tag);
  write_state_data(file, g, &er_hash, tag);
  write_symbol_data(file, g, tag);
  write_passes(file, g, tag);
  vec_free(&er_hash);

  if ((p = lookup_production(g, "whitespace", sizeof("whitespace") - 1))) whitespace_production = p->state->index;

  if (file->binary) {
    file->d_parser_tables_loc = file->tables.cur - file->tables.start;
  }

  start_struct(file, D_ParserTables, make_name("parser_tables_%s", tag), "\n");
  add_struct_member(file, D_ParserTables, "%d", g->states.n, nstates);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_states_%s", tag), state);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_gotos_%s", tag), goto_table);
  add_struct_member(file, D_ParserTables, "%d", whitespace_production, whitespace_state);
  add_struct_member(file, D_ParserTables, "%d", g->productions.n + g->terminals.n, nsymbols);
  add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_symbols_%s", tag), symbols);
  if (g->default_white_space) {
    assert(!file->binary);
    fprintf(file->fp, ", %s", g->default_white_space);
  } else {
    add_struct_ptr_member(file, D_ParserTables, "", &null_entry, default_white_space);
  }
  add_struct_member(file, D_ParserTables, "%d", g->passes.n, npasses);
  if (g->passes.n){
    add_struct_ptr_member(file, D_ParserTables, "", get_offset(file, "d_passes_%s", tag), passes);
  } else {
    add_struct_ptr_member(file, D_ParserTables, "", &null_entry, passes);
  }
  if (g->save_parse_tree) {
    add_struct_member(file, D_ParserTables, "%d", 1, save_parse_tree);
  } else {
    add_struct_member(file, D_ParserTables, "%d", 0, save_parse_tree);
  }
  end_struct(file, D_ParserTables, "\n");

  if (file->binary) {
    if (!file->str) {
      file->fp = fopen(g->write_pathname, "wb");
      if (!file->fp) d_fail("unable to open `%s` for write\n", g->pathname);
    }
    save_binary_tables(file);
  }
  free_tables(file);
  if (file->fp) fclose(file->fp);
}